

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiMBIntersector1<4>::
     occluded_h<embree::sse2::RibbonCurve1Intersector1<embree::HermiteCurveT,4>,embree::sse2::Occluded1EpilogMU<4,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  RTCRayQueryFlags *pRVar7;
  Primitive *pPVar8;
  undefined1 (*pauVar9) [16];
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Primitive PVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  long lVar22;
  RTCFilterFunctionN p_Var23;
  long lVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined8 uVar29;
  undefined6 uVar30;
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  bool bVar52;
  int iVar53;
  ulong uVar54;
  long lVar55;
  RTCIntersectArguments *pRVar56;
  undefined4 uVar57;
  RTCIntersectArguments *pRVar58;
  ulong uVar59;
  Geometry *geometry;
  long lVar60;
  undefined1 auVar61 [8];
  ulong uVar62;
  ulong uVar63;
  bool bVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  short sVar71;
  float fVar72;
  float fVar101;
  float fVar102;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar103;
  float fVar104;
  float fVar121;
  float fVar123;
  undefined1 auVar105 [16];
  undefined1 auVar108 [16];
  undefined1 auVar111 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar122;
  float fVar124;
  float fVar125;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar126;
  float fVar127;
  float fVar133;
  float fVar135;
  vfloat4 v;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar134;
  float fVar136;
  float fVar137;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar138;
  float fVar149;
  float fVar150;
  vfloat4 v_1;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar143 [16];
  float fVar151;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar165;
  float fVar168;
  undefined1 auVar155 [16];
  float fVar166;
  float fVar167;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar173;
  float fVar196;
  float fVar197;
  undefined1 auVar174 [16];
  undefined1 auVar177 [16];
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar186 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar198;
  float fVar199;
  float fVar203;
  float fVar205;
  undefined1 auVar200 [16];
  float fVar204;
  float fVar206;
  float fVar207;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar208;
  float fVar215;
  float fVar216;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar213 [16];
  float fVar217;
  undefined1 auVar214 [16];
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar230;
  float fVar231;
  undefined1 auVar222 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  undefined1 auVar236 [16];
  undefined1 auVar239 [16];
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar260;
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar279;
  float fVar281;
  float fVar283;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar280;
  float fVar282;
  float fVar284;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar285;
  float fVar288;
  float fVar289;
  float fVar291;
  undefined1 auVar286 [16];
  float fVar290;
  float fVar292;
  undefined1 auVar287 [16];
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_4> bhit;
  bool local_449;
  int local_41c;
  undefined1 local_418 [8];
  undefined8 uStack_410;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  undefined8 uStack_3d0;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined8 local_3b8;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  ulong local_318;
  Precalculations *local_310;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  RTCFilterFunctionNArguments local_2b8;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined8 local_258;
  undefined8 uStack_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined8 local_238;
  float local_230;
  float local_22c;
  undefined4 local_228;
  undefined4 local_224;
  undefined4 local_220;
  uint local_21c;
  uint local_218;
  ulong local_200;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  Primitive *local_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  uint local_158;
  float local_154;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_108 [16];
  float local_f8 [4];
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8 [4];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 uVar99;
  undefined2 uVar100;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  
  PVar18 = prim[1];
  uVar54 = (ulong)(byte)PVar18;
  lVar24 = uVar54 * 0x25;
  pPVar8 = prim + lVar24 + 6;
  fVar135 = *(float *)(pPVar8 + 0xc);
  fVar138 = ((ray->org).field_0.m128[0] - *(float *)pPVar8) * fVar135;
  fVar149 = ((ray->org).field_0.m128[1] - *(float *)(pPVar8 + 4)) * fVar135;
  fVar150 = ((ray->org).field_0.m128[2] - *(float *)(pPVar8 + 8)) * fVar135;
  fVar126 = fVar135 * (ray->dir).field_0.m128[0];
  fVar133 = fVar135 * (ray->dir).field_0.m128[1];
  fVar135 = fVar135 * (ray->dir).field_0.m128[2];
  uVar57 = *(undefined4 *)(prim + uVar54 * 4 + 6);
  uVar99 = (undefined1)((uint)uVar57 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar57 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar57));
  uVar99 = (undefined1)((uint)uVar57 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar57,(char)uVar57);
  uVar62 = CONCAT62(uVar30,sVar71);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar62;
  auVar73._12_2_ = uVar100;
  auVar73._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar129._12_4_ = auVar73._12_4_;
  auVar129._8_2_ = 0;
  auVar129._0_8_ = uVar62;
  auVar129._10_2_ = uVar100;
  auVar74._10_6_ = auVar129._10_6_;
  auVar74._8_2_ = uVar100;
  auVar74._0_8_ = uVar62;
  uVar100 = (undefined2)uVar30;
  auVar31._4_8_ = auVar74._8_8_;
  auVar31._2_2_ = uVar100;
  auVar31._0_2_ = uVar100;
  fVar271 = (float)((int)sVar71 >> 8);
  fVar279 = (float)(auVar31._0_4_ >> 0x18);
  fVar281 = (float)(auVar74._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 5 + 6);
  uVar99 = (undefined1)((uint)uVar57 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar57 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar57));
  uVar99 = (undefined1)((uint)uVar57 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar57,(char)uVar57);
  uVar62 = CONCAT62(uVar30,sVar71);
  auVar107._8_4_ = 0;
  auVar107._0_8_ = uVar62;
  auVar107._12_2_ = uVar100;
  auVar107._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar106._12_4_ = auVar107._12_4_;
  auVar106._8_2_ = 0;
  auVar106._0_8_ = uVar62;
  auVar106._10_2_ = uVar100;
  auVar105._10_6_ = auVar106._10_6_;
  auVar105._8_2_ = uVar100;
  auVar105._0_8_ = uVar62;
  uVar100 = (undefined2)uVar30;
  auVar32._4_8_ = auVar105._8_8_;
  auVar32._2_2_ = uVar100;
  auVar32._0_2_ = uVar100;
  fVar152 = (float)((int)sVar71 >> 8);
  fVar165 = (float)(auVar32._0_4_ >> 0x18);
  fVar168 = (float)(auVar105._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 6 + 6);
  uVar99 = (undefined1)((uint)uVar57 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar57 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar57));
  uVar99 = (undefined1)((uint)uVar57 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar57,(char)uVar57);
  uVar62 = CONCAT62(uVar30,sVar71);
  auVar110._8_4_ = 0;
  auVar110._0_8_ = uVar62;
  auVar110._12_2_ = uVar100;
  auVar110._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar109._12_4_ = auVar110._12_4_;
  auVar109._8_2_ = 0;
  auVar109._0_8_ = uVar62;
  auVar109._10_2_ = uVar100;
  auVar108._10_6_ = auVar109._10_6_;
  auVar108._8_2_ = uVar100;
  auVar108._0_8_ = uVar62;
  uVar100 = (undefined2)uVar30;
  auVar33._4_8_ = auVar108._8_8_;
  auVar33._2_2_ = uVar100;
  auVar33._0_2_ = uVar100;
  fVar198 = (float)((int)sVar71 >> 8);
  fVar203 = (float)(auVar33._0_4_ >> 0x18);
  fVar205 = (float)(auVar108._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 0xf + 6);
  uVar99 = (undefined1)((uint)uVar57 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar57 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar57));
  uVar99 = (undefined1)((uint)uVar57 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar57,(char)uVar57);
  uVar62 = CONCAT62(uVar30,sVar71);
  auVar113._8_4_ = 0;
  auVar113._0_8_ = uVar62;
  auVar113._12_2_ = uVar100;
  auVar113._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar112._12_4_ = auVar113._12_4_;
  auVar112._8_2_ = 0;
  auVar112._0_8_ = uVar62;
  auVar112._10_2_ = uVar100;
  auVar111._10_6_ = auVar112._10_6_;
  auVar111._8_2_ = uVar100;
  auVar111._0_8_ = uVar62;
  uVar100 = (undefined2)uVar30;
  auVar34._4_8_ = auVar111._8_8_;
  auVar34._2_2_ = uVar100;
  auVar34._0_2_ = uVar100;
  fVar72 = (float)((int)sVar71 >> 8);
  fVar101 = (float)(auVar34._0_4_ >> 0x18);
  fVar102 = (float)(auVar111._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + 6);
  uVar99 = (undefined1)((uint)uVar57 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar57 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar57));
  uVar99 = (undefined1)((uint)uVar57 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar57,(char)uVar57);
  uVar62 = CONCAT62(uVar30,sVar71);
  auVar176._8_4_ = 0;
  auVar176._0_8_ = uVar62;
  auVar176._12_2_ = uVar100;
  auVar176._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar175._12_4_ = auVar176._12_4_;
  auVar175._8_2_ = 0;
  auVar175._0_8_ = uVar62;
  auVar175._10_2_ = uVar100;
  auVar174._10_6_ = auVar175._10_6_;
  auVar174._8_2_ = uVar100;
  auVar174._0_8_ = uVar62;
  uVar100 = (undefined2)uVar30;
  auVar35._4_8_ = auVar174._8_8_;
  auVar35._2_2_ = uVar100;
  auVar35._0_2_ = uVar100;
  fVar208 = (float)((int)sVar71 >> 8);
  fVar215 = (float)(auVar35._0_4_ >> 0x18);
  fVar216 = (float)(auVar174._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + uVar54 + 6);
  uVar99 = (undefined1)((uint)uVar57 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar57 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar57));
  uVar99 = (undefined1)((uint)uVar57 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar57,(char)uVar57);
  uVar62 = CONCAT62(uVar30,sVar71);
  auVar179._8_4_ = 0;
  auVar179._0_8_ = uVar62;
  auVar179._12_2_ = uVar100;
  auVar179._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._8_2_ = 0;
  auVar178._0_8_ = uVar62;
  auVar178._10_2_ = uVar100;
  auVar177._10_6_ = auVar178._10_6_;
  auVar177._8_2_ = uVar100;
  auVar177._0_8_ = uVar62;
  uVar100 = (undefined2)uVar30;
  auVar36._4_8_ = auVar177._8_8_;
  auVar36._2_2_ = uVar100;
  auVar36._0_2_ = uVar100;
  fVar221 = (float)((int)sVar71 >> 8);
  fVar230 = (float)(auVar36._0_4_ >> 0x18);
  fVar231 = (float)(auVar177._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 0x1a + 6);
  uVar99 = (undefined1)((uint)uVar57 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar57 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar57));
  uVar99 = (undefined1)((uint)uVar57 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar57,(char)uVar57);
  uVar62 = CONCAT62(uVar30,sVar71);
  auVar182._8_4_ = 0;
  auVar182._0_8_ = uVar62;
  auVar182._12_2_ = uVar100;
  auVar182._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar181._12_4_ = auVar182._12_4_;
  auVar181._8_2_ = 0;
  auVar181._0_8_ = uVar62;
  auVar181._10_2_ = uVar100;
  auVar180._10_6_ = auVar181._10_6_;
  auVar180._8_2_ = uVar100;
  auVar180._0_8_ = uVar62;
  uVar100 = (undefined2)uVar30;
  auVar37._4_8_ = auVar180._8_8_;
  auVar37._2_2_ = uVar100;
  auVar37._0_2_ = uVar100;
  fVar218 = (float)((int)sVar71 >> 8);
  fVar219 = (float)(auVar37._0_4_ >> 0x18);
  fVar220 = (float)(auVar180._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 0x1b + 6);
  uVar99 = (undefined1)((uint)uVar57 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar57 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar57));
  uVar99 = (undefined1)((uint)uVar57 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar57,(char)uVar57);
  uVar62 = CONCAT62(uVar30,sVar71);
  auVar185._8_4_ = 0;
  auVar185._0_8_ = uVar62;
  auVar185._12_2_ = uVar100;
  auVar185._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._8_2_ = 0;
  auVar184._0_8_ = uVar62;
  auVar184._10_2_ = uVar100;
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._8_2_ = uVar100;
  auVar183._0_8_ = uVar62;
  uVar100 = (undefined2)uVar30;
  auVar38._4_8_ = auVar183._8_8_;
  auVar38._2_2_ = uVar100;
  auVar38._0_2_ = uVar100;
  fVar232 = (float)((int)sVar71 >> 8);
  fVar240 = (float)(auVar38._0_4_ >> 0x18);
  fVar244 = (float)(auVar183._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 0x1c + 6);
  uVar99 = (undefined1)((uint)uVar57 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar57 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar57));
  uVar99 = (undefined1)((uint)uVar57 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar57,(char)uVar57);
  uVar62 = CONCAT62(uVar30,sVar71);
  auVar188._8_4_ = 0;
  auVar188._0_8_ = uVar62;
  auVar188._12_2_ = uVar100;
  auVar188._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._8_2_ = 0;
  auVar187._0_8_ = uVar62;
  auVar187._10_2_ = uVar100;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = uVar100;
  auVar186._0_8_ = uVar62;
  uVar100 = (undefined2)uVar30;
  auVar39._4_8_ = auVar186._8_8_;
  auVar39._2_2_ = uVar100;
  auVar39._0_2_ = uVar100;
  fVar103 = (float)((int)sVar71 >> 8);
  fVar121 = (float)(auVar39._0_4_ >> 0x18);
  fVar123 = (float)(auVar186._8_4_ >> 0x18);
  fVar260 = fVar126 * fVar271 + fVar133 * fVar152 + fVar135 * fVar198;
  fVar268 = fVar126 * fVar279 + fVar133 * fVar165 + fVar135 * fVar203;
  fVar269 = fVar126 * fVar281 + fVar133 * fVar168 + fVar135 * fVar205;
  fVar270 = fVar126 * (float)(auVar129._12_4_ >> 0x18) +
            fVar133 * (float)(auVar106._12_4_ >> 0x18) + fVar135 * (float)(auVar109._12_4_ >> 0x18);
  fVar250 = fVar126 * fVar72 + fVar133 * fVar208 + fVar135 * fVar221;
  fVar257 = fVar126 * fVar101 + fVar133 * fVar215 + fVar135 * fVar230;
  fVar258 = fVar126 * fVar102 + fVar133 * fVar216 + fVar135 * fVar231;
  fVar259 = fVar126 * (float)(auVar112._12_4_ >> 0x18) +
            fVar133 * (float)(auVar175._12_4_ >> 0x18) + fVar135 * (float)(auVar178._12_4_ >> 0x18);
  fVar173 = fVar126 * fVar218 + fVar133 * fVar232 + fVar135 * fVar103;
  fVar196 = fVar126 * fVar219 + fVar133 * fVar240 + fVar135 * fVar121;
  fVar197 = fVar126 * fVar220 + fVar133 * fVar244 + fVar135 * fVar123;
  fVar126 = fVar126 * (float)(auVar181._12_4_ >> 0x18) +
            fVar133 * (float)(auVar184._12_4_ >> 0x18) + fVar135 * (float)(auVar187._12_4_ >> 0x18);
  fVar272 = fVar271 * fVar138 + fVar152 * fVar149 + fVar198 * fVar150;
  fVar279 = fVar279 * fVar138 + fVar165 * fVar149 + fVar203 * fVar150;
  fVar281 = fVar281 * fVar138 + fVar168 * fVar149 + fVar205 * fVar150;
  fVar283 = (float)(auVar129._12_4_ >> 0x18) * fVar138 +
            (float)(auVar106._12_4_ >> 0x18) * fVar149 + (float)(auVar109._12_4_ >> 0x18) * fVar150;
  fVar221 = fVar72 * fVar138 + fVar208 * fVar149 + fVar221 * fVar150;
  fVar230 = fVar101 * fVar138 + fVar215 * fVar149 + fVar230 * fVar150;
  fVar231 = fVar102 * fVar138 + fVar216 * fVar149 + fVar231 * fVar150;
  fVar271 = (float)(auVar112._12_4_ >> 0x18) * fVar138 +
            (float)(auVar175._12_4_ >> 0x18) * fVar149 + (float)(auVar178._12_4_ >> 0x18) * fVar150;
  fVar218 = fVar138 * fVar218 + fVar149 * fVar232 + fVar150 * fVar103;
  fVar219 = fVar138 * fVar219 + fVar149 * fVar240 + fVar150 * fVar121;
  fVar220 = fVar138 * fVar220 + fVar149 * fVar244 + fVar150 * fVar123;
  fVar232 = fVar138 * (float)(auVar181._12_4_ >> 0x18) +
            fVar149 * (float)(auVar184._12_4_ >> 0x18) + fVar150 * (float)(auVar187._12_4_ >> 0x18);
  fVar135 = (float)DAT_01ff1d40;
  fVar72 = DAT_01ff1d40._4_4_;
  fVar101 = DAT_01ff1d40._8_4_;
  fVar102 = DAT_01ff1d40._12_4_;
  uVar65 = -(uint)(fVar135 <= ABS(fVar260));
  uVar66 = -(uint)(fVar72 <= ABS(fVar268));
  uVar67 = -(uint)(fVar101 <= ABS(fVar269));
  uVar68 = -(uint)(fVar102 <= ABS(fVar270));
  auVar261._0_4_ = (uint)fVar260 & uVar65;
  auVar261._4_4_ = (uint)fVar268 & uVar66;
  auVar261._8_4_ = (uint)fVar269 & uVar67;
  auVar261._12_4_ = (uint)fVar270 & uVar68;
  auVar139._0_4_ = ~uVar65 & (uint)fVar135;
  auVar139._4_4_ = ~uVar66 & (uint)fVar72;
  auVar139._8_4_ = ~uVar67 & (uint)fVar101;
  auVar139._12_4_ = ~uVar68 & (uint)fVar102;
  auVar139 = auVar139 | auVar261;
  uVar65 = -(uint)(fVar135 <= ABS(fVar250));
  uVar66 = -(uint)(fVar72 <= ABS(fVar257));
  uVar67 = -(uint)(fVar101 <= ABS(fVar258));
  uVar68 = -(uint)(fVar102 <= ABS(fVar259));
  auVar251._0_4_ = (uint)fVar250 & uVar65;
  auVar251._4_4_ = (uint)fVar257 & uVar66;
  auVar251._8_4_ = (uint)fVar258 & uVar67;
  auVar251._12_4_ = (uint)fVar259 & uVar68;
  auVar200._0_4_ = ~uVar65 & (uint)fVar135;
  auVar200._4_4_ = ~uVar66 & (uint)fVar72;
  auVar200._8_4_ = ~uVar67 & (uint)fVar101;
  auVar200._12_4_ = ~uVar68 & (uint)fVar102;
  auVar200 = auVar200 | auVar251;
  uVar65 = -(uint)(fVar135 <= ABS(fVar173));
  uVar66 = -(uint)(fVar72 <= ABS(fVar196));
  uVar67 = -(uint)(fVar101 <= ABS(fVar197));
  uVar68 = -(uint)(fVar102 <= ABS(fVar126));
  auVar189._0_4_ = (uint)fVar173 & uVar65;
  auVar189._4_4_ = (uint)fVar196 & uVar66;
  auVar189._8_4_ = (uint)fVar197 & uVar67;
  auVar189._12_4_ = (uint)fVar126 & uVar68;
  auVar209._0_4_ = ~uVar65 & (uint)fVar135;
  auVar209._4_4_ = ~uVar66 & (uint)fVar72;
  auVar209._8_4_ = ~uVar67 & (uint)fVar101;
  auVar209._12_4_ = ~uVar68 & (uint)fVar102;
  auVar209 = auVar209 | auVar189;
  auVar74 = rcpps(_DAT_01ff1d40,auVar139);
  fVar135 = auVar74._0_4_;
  fVar102 = auVar74._4_4_;
  fVar152 = auVar74._8_4_;
  fVar208 = auVar74._12_4_;
  fVar135 = (1.0 - auVar139._0_4_ * fVar135) * fVar135 + fVar135;
  fVar102 = (1.0 - auVar139._4_4_ * fVar102) * fVar102 + fVar102;
  fVar152 = (1.0 - auVar139._8_4_ * fVar152) * fVar152 + fVar152;
  fVar208 = (1.0 - auVar139._12_4_ * fVar208) * fVar208 + fVar208;
  auVar74 = rcpps(auVar74,auVar200);
  fVar72 = auVar74._0_4_;
  fVar103 = auVar74._4_4_;
  fVar165 = auVar74._8_4_;
  fVar215 = auVar74._12_4_;
  fVar72 = (1.0 - auVar200._0_4_ * fVar72) * fVar72 + fVar72;
  fVar103 = (1.0 - auVar200._4_4_ * fVar103) * fVar103 + fVar103;
  fVar165 = (1.0 - auVar200._8_4_ * fVar165) * fVar165 + fVar165;
  fVar215 = (1.0 - auVar200._12_4_ * fVar215) * fVar215 + fVar215;
  auVar74 = rcpps(auVar74,auVar209);
  fVar101 = auVar74._0_4_;
  fVar121 = auVar74._4_4_;
  fVar168 = auVar74._8_4_;
  fVar216 = auVar74._12_4_;
  fVar101 = (1.0 - auVar209._0_4_ * fVar101) * fVar101 + fVar101;
  fVar121 = (1.0 - auVar209._4_4_ * fVar121) * fVar121 + fVar121;
  fVar168 = (1.0 - auVar209._8_4_ * fVar168) * fVar168 + fVar168;
  fVar216 = (1.0 - auVar209._12_4_ * fVar216) * fVar216 + fVar216;
  fVar240 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar24 + 0x16)) *
            *(float *)(prim + lVar24 + 0x1a);
  uVar62 = *(ulong *)(prim + uVar54 * 7 + 6);
  uVar100 = (undefined2)(uVar62 >> 0x30);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar62;
  auVar77._12_2_ = uVar100;
  auVar77._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar62 >> 0x20);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar62;
  auVar76._10_2_ = uVar100;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._8_2_ = uVar100;
  auVar75._0_8_ = uVar62;
  uVar100 = (undefined2)(uVar62 >> 0x10);
  auVar40._4_8_ = auVar75._8_8_;
  auVar40._2_2_ = uVar100;
  auVar40._0_2_ = uVar100;
  fVar123 = (float)(auVar40._0_4_ >> 0x10);
  fVar173 = (float)(auVar75._8_4_ >> 0x10);
  uVar59 = *(ulong *)(prim + uVar54 * 0xb + 6);
  uVar100 = (undefined2)(uVar59 >> 0x30);
  auVar142._8_4_ = 0;
  auVar142._0_8_ = uVar59;
  auVar142._12_2_ = uVar100;
  auVar142._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar59 >> 0x20);
  auVar141._12_4_ = auVar142._12_4_;
  auVar141._8_2_ = 0;
  auVar141._0_8_ = uVar59;
  auVar141._10_2_ = uVar100;
  auVar140._10_6_ = auVar141._10_6_;
  auVar140._8_2_ = uVar100;
  auVar140._0_8_ = uVar59;
  uVar100 = (undefined2)(uVar59 >> 0x10);
  auVar41._4_8_ = auVar140._8_8_;
  auVar41._2_2_ = uVar100;
  auVar41._0_2_ = uVar100;
  uVar10 = *(ulong *)(prim + uVar54 * 9 + 6);
  uVar100 = (undefined2)(uVar10 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar10;
  auVar80._12_2_ = uVar100;
  auVar80._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar10 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar10;
  auVar79._10_2_ = uVar100;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar100;
  auVar78._0_8_ = uVar10;
  uVar100 = (undefined2)(uVar10 >> 0x10);
  auVar42._4_8_ = auVar78._8_8_;
  auVar42._2_2_ = uVar100;
  auVar42._0_2_ = uVar100;
  fVar126 = (float)(auVar42._0_4_ >> 0x10);
  fVar196 = (float)(auVar78._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar54 * 0xd + 6);
  uVar100 = (undefined2)(uVar11 >> 0x30);
  auVar212._8_4_ = 0;
  auVar212._0_8_ = uVar11;
  auVar212._12_2_ = uVar100;
  auVar212._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar11 >> 0x20);
  auVar211._12_4_ = auVar212._12_4_;
  auVar211._8_2_ = 0;
  auVar211._0_8_ = uVar11;
  auVar211._10_2_ = uVar100;
  auVar210._10_6_ = auVar211._10_6_;
  auVar210._8_2_ = uVar100;
  auVar210._0_8_ = uVar11;
  uVar100 = (undefined2)(uVar11 >> 0x10);
  auVar43._4_8_ = auVar210._8_8_;
  auVar43._2_2_ = uVar100;
  auVar43._0_2_ = uVar100;
  uVar12 = *(ulong *)(prim + uVar54 * 0x12 + 6);
  uVar100 = (undefined2)(uVar12 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar12;
  auVar83._12_2_ = uVar100;
  auVar83._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar12 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar12;
  auVar82._10_2_ = uVar100;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar100;
  auVar81._0_8_ = uVar12;
  uVar100 = (undefined2)(uVar12 >> 0x10);
  auVar44._4_8_ = auVar81._8_8_;
  auVar44._2_2_ = uVar100;
  auVar44._0_2_ = uVar100;
  fVar133 = (float)(auVar44._0_4_ >> 0x10);
  fVar197 = (float)(auVar81._8_4_ >> 0x10);
  uVar63 = (ulong)(uint)((int)(uVar54 * 5) << 2);
  uVar13 = *(ulong *)(prim + uVar54 * 2 + uVar63 + 6);
  uVar100 = (undefined2)(uVar13 >> 0x30);
  auVar224._8_4_ = 0;
  auVar224._0_8_ = uVar13;
  auVar224._12_2_ = uVar100;
  auVar224._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar13 >> 0x20);
  auVar223._12_4_ = auVar224._12_4_;
  auVar223._8_2_ = 0;
  auVar223._0_8_ = uVar13;
  auVar223._10_2_ = uVar100;
  auVar222._10_6_ = auVar223._10_6_;
  auVar222._8_2_ = uVar100;
  auVar222._0_8_ = uVar13;
  uVar100 = (undefined2)(uVar13 >> 0x10);
  auVar45._4_8_ = auVar222._8_8_;
  auVar45._2_2_ = uVar100;
  auVar45._0_2_ = uVar100;
  uVar63 = *(ulong *)(prim + uVar63 + 6);
  uVar100 = (undefined2)(uVar63 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar63;
  auVar86._12_2_ = uVar100;
  auVar86._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar63 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar63;
  auVar85._10_2_ = uVar100;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar100;
  auVar84._0_8_ = uVar63;
  uVar100 = (undefined2)(uVar63 >> 0x10);
  auVar46._4_8_ = auVar84._8_8_;
  auVar46._2_2_ = uVar100;
  auVar46._0_2_ = uVar100;
  fVar138 = (float)(auVar46._0_4_ >> 0x10);
  fVar198 = (float)(auVar84._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar54 * 0x18 + 6);
  uVar100 = (undefined2)(uVar14 >> 0x30);
  auVar238._8_4_ = 0;
  auVar238._0_8_ = uVar14;
  auVar238._12_2_ = uVar100;
  auVar238._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar14 >> 0x20);
  auVar237._12_4_ = auVar238._12_4_;
  auVar237._8_2_ = 0;
  auVar237._0_8_ = uVar14;
  auVar237._10_2_ = uVar100;
  auVar236._10_6_ = auVar237._10_6_;
  auVar236._8_2_ = uVar100;
  auVar236._0_8_ = uVar14;
  uVar100 = (undefined2)(uVar14 >> 0x10);
  auVar47._4_8_ = auVar236._8_8_;
  auVar47._2_2_ = uVar100;
  auVar47._0_2_ = uVar100;
  uVar15 = *(ulong *)(prim + uVar54 * 0x1d + 6);
  uVar100 = (undefined2)(uVar15 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar15;
  auVar89._12_2_ = uVar100;
  auVar89._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar15 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar15;
  auVar88._10_2_ = uVar100;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar100;
  auVar87._0_8_ = uVar15;
  uVar100 = (undefined2)(uVar15 >> 0x10);
  auVar48._4_8_ = auVar87._8_8_;
  auVar48._2_2_ = uVar100;
  auVar48._0_2_ = uVar100;
  fVar149 = (float)(auVar48._0_4_ >> 0x10);
  fVar203 = (float)(auVar87._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar54 + (ulong)(byte)PVar18 * 0x20 + 6);
  uVar100 = (undefined2)(uVar16 >> 0x30);
  auVar254._8_4_ = 0;
  auVar254._0_8_ = uVar16;
  auVar254._12_2_ = uVar100;
  auVar254._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar16 >> 0x20);
  auVar253._12_4_ = auVar254._12_4_;
  auVar253._8_2_ = 0;
  auVar253._0_8_ = uVar16;
  auVar253._10_2_ = uVar100;
  auVar252._10_6_ = auVar253._10_6_;
  auVar252._8_2_ = uVar100;
  auVar252._0_8_ = uVar16;
  uVar100 = (undefined2)(uVar16 >> 0x10);
  auVar49._4_8_ = auVar252._8_8_;
  auVar49._2_2_ = uVar100;
  auVar49._0_2_ = uVar100;
  uVar17 = *(ulong *)(prim + ((ulong)(byte)PVar18 * 0x20 - uVar54) + 6);
  uVar100 = (undefined2)(uVar17 >> 0x30);
  auVar92._8_4_ = 0;
  auVar92._0_8_ = uVar17;
  auVar92._12_2_ = uVar100;
  auVar92._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar17 >> 0x20);
  auVar91._12_4_ = auVar92._12_4_;
  auVar91._8_2_ = 0;
  auVar91._0_8_ = uVar17;
  auVar91._10_2_ = uVar100;
  auVar90._10_6_ = auVar91._10_6_;
  auVar90._8_2_ = uVar100;
  auVar90._0_8_ = uVar17;
  uVar100 = (undefined2)(uVar17 >> 0x10);
  auVar50._4_8_ = auVar90._8_8_;
  auVar50._2_2_ = uVar100;
  auVar50._0_2_ = uVar100;
  fVar150 = (float)(auVar50._0_4_ >> 0x10);
  fVar205 = (float)(auVar90._8_4_ >> 0x10);
  uVar54 = *(ulong *)(prim + uVar54 * 0x23 + 6);
  uVar100 = (undefined2)(uVar54 >> 0x30);
  auVar264._8_4_ = 0;
  auVar264._0_8_ = uVar54;
  auVar264._12_2_ = uVar100;
  auVar264._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar54 >> 0x20);
  auVar263._12_4_ = auVar264._12_4_;
  auVar263._8_2_ = 0;
  auVar263._0_8_ = uVar54;
  auVar263._10_2_ = uVar100;
  auVar262._10_6_ = auVar263._10_6_;
  auVar262._8_2_ = uVar100;
  auVar262._0_8_ = uVar54;
  uVar100 = (undefined2)(uVar54 >> 0x10);
  auVar51._4_8_ = auVar262._8_8_;
  auVar51._2_2_ = uVar100;
  auVar51._0_2_ = uVar100;
  auVar143._0_8_ =
       CONCAT44(((((float)(auVar41._0_4_ >> 0x10) - fVar123) * fVar240 + fVar123) - fVar279) *
                fVar102,((((float)(int)(short)uVar59 - (float)(int)(short)uVar62) * fVar240 +
                         (float)(int)(short)uVar62) - fVar272) * fVar135);
  auVar143._8_4_ =
       ((((float)(auVar140._8_4_ >> 0x10) - fVar173) * fVar240 + fVar173) - fVar281) * fVar152;
  auVar143._12_4_ =
       ((((float)(auVar141._12_4_ >> 0x10) - (float)(auVar76._12_4_ >> 0x10)) * fVar240 +
        (float)(auVar76._12_4_ >> 0x10)) - fVar283) * fVar208;
  auVar213._0_4_ =
       ((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar240 +
        (float)(int)(short)uVar10) - fVar272) * fVar135;
  auVar213._4_4_ =
       ((((float)(auVar43._0_4_ >> 0x10) - fVar126) * fVar240 + fVar126) - fVar279) * fVar102;
  auVar213._8_4_ =
       ((((float)(auVar210._8_4_ >> 0x10) - fVar196) * fVar240 + fVar196) - fVar281) * fVar152;
  auVar213._12_4_ =
       ((((float)(auVar211._12_4_ >> 0x10) - (float)(auVar79._12_4_ >> 0x10)) * fVar240 +
        (float)(auVar79._12_4_ >> 0x10)) - fVar283) * fVar208;
  auVar225._0_8_ =
       CONCAT44(((((float)(auVar45._0_4_ >> 0x10) - fVar133) * fVar240 + fVar133) - fVar230) *
                fVar103,((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar240 +
                         (float)(int)(short)uVar12) - fVar221) * fVar72);
  auVar225._8_4_ =
       ((((float)(auVar222._8_4_ >> 0x10) - fVar197) * fVar240 + fVar197) - fVar231) * fVar165;
  auVar225._12_4_ =
       ((((float)(auVar223._12_4_ >> 0x10) - (float)(auVar82._12_4_ >> 0x10)) * fVar240 +
        (float)(auVar82._12_4_ >> 0x10)) - fVar271) * fVar215;
  auVar239._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar63) * fVar240 +
        (float)(int)(short)uVar63) - fVar221) * fVar72;
  auVar239._4_4_ =
       ((((float)(auVar47._0_4_ >> 0x10) - fVar138) * fVar240 + fVar138) - fVar230) * fVar103;
  auVar239._8_4_ =
       ((((float)(auVar236._8_4_ >> 0x10) - fVar198) * fVar240 + fVar198) - fVar231) * fVar165;
  auVar239._12_4_ =
       ((((float)(auVar237._12_4_ >> 0x10) - (float)(auVar85._12_4_ >> 0x10)) * fVar240 +
        (float)(auVar85._12_4_ >> 0x10)) - fVar271) * fVar215;
  auVar255._0_8_ =
       CONCAT44(((((float)(auVar49._0_4_ >> 0x10) - fVar149) * fVar240 + fVar149) - fVar219) *
                fVar121,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar240 +
                         (float)(int)(short)uVar15) - fVar218) * fVar101);
  auVar255._8_4_ =
       ((((float)(auVar252._8_4_ >> 0x10) - fVar203) * fVar240 + fVar203) - fVar220) * fVar168;
  auVar255._12_4_ =
       ((((float)(auVar253._12_4_ >> 0x10) - (float)(auVar88._12_4_ >> 0x10)) * fVar240 +
        (float)(auVar88._12_4_ >> 0x10)) - fVar232) * fVar216;
  auVar265._0_4_ =
       ((((float)(int)(short)uVar54 - (float)(int)(short)uVar17) * fVar240 +
        (float)(int)(short)uVar17) - fVar218) * fVar101;
  auVar265._4_4_ =
       ((((float)(auVar51._0_4_ >> 0x10) - fVar150) * fVar240 + fVar150) - fVar219) * fVar121;
  auVar265._8_4_ =
       ((((float)(auVar262._8_4_ >> 0x10) - fVar205) * fVar240 + fVar205) - fVar220) * fVar168;
  auVar265._12_4_ =
       ((((float)(auVar263._12_4_ >> 0x10) - (float)(auVar91._12_4_ >> 0x10)) * fVar240 +
        (float)(auVar91._12_4_ >> 0x10)) - fVar232) * fVar216;
  auVar128._8_4_ = auVar143._8_4_;
  auVar128._0_8_ = auVar143._0_8_;
  auVar128._12_4_ = auVar143._12_4_;
  auVar129 = minps(auVar128,auVar213);
  auVar93._8_4_ = auVar225._8_4_;
  auVar93._0_8_ = auVar225._0_8_;
  auVar93._12_4_ = auVar225._12_4_;
  auVar74 = minps(auVar93,auVar239);
  auVar129 = maxps(auVar129,auVar74);
  auVar94._8_4_ = auVar255._8_4_;
  auVar94._0_8_ = auVar255._0_8_;
  auVar94._12_4_ = auVar255._12_4_;
  auVar74 = minps(auVar94,auVar265);
  uVar57 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar114._4_4_ = uVar57;
  auVar114._0_4_ = uVar57;
  auVar114._8_4_ = uVar57;
  auVar114._12_4_ = uVar57;
  auVar74 = maxps(auVar74,auVar114);
  auVar74 = maxps(auVar129,auVar74);
  local_48 = auVar74._0_4_ * 0.99999964;
  fStack_44 = auVar74._4_4_ * 0.99999964;
  fStack_40 = auVar74._8_4_ * 0.99999964;
  fStack_3c = auVar74._12_4_ * 0.99999964;
  auVar74 = maxps(auVar143,auVar213);
  auVar129 = maxps(auVar225,auVar239);
  auVar74 = minps(auVar74,auVar129);
  auVar129 = maxps(auVar255,auVar265);
  fVar135 = ray->tfar;
  auVar95._4_4_ = fVar135;
  auVar95._0_4_ = fVar135;
  auVar95._8_4_ = fVar135;
  auVar95._12_4_ = fVar135;
  auVar129 = minps(auVar129,auVar95);
  auVar74 = minps(auVar74,auVar129);
  uVar65 = (uint)(byte)PVar18;
  auVar115._0_4_ = -(uint)(uVar65 != 0 && local_48 <= auVar74._0_4_ * 1.0000004);
  auVar115._4_4_ = -(uint)(1 < uVar65 && fStack_44 <= auVar74._4_4_ * 1.0000004);
  auVar115._8_4_ = -(uint)(2 < uVar65 && fStack_40 <= auVar74._8_4_ * 1.0000004);
  auVar115._12_4_ = -(uint)(3 < uVar65 && fStack_3c <= auVar74._12_4_ * 1.0000004);
  uVar65 = movmskps(uVar65,auVar115);
  local_449 = uVar65 != 0;
  if (local_449) {
    uVar65 = uVar65 & 0xff;
    local_2f8 = mm_lookupmask_ps._0_8_;
    uStack_2f0 = mm_lookupmask_ps._8_8_;
    local_310 = pre;
    local_190 = prim;
    do {
      lVar24 = 0;
      if (uVar65 != 0) {
        for (; (uVar65 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
        }
      }
      local_318 = (ulong)*(uint *)(local_190 + 2);
      local_200 = (ulong)*(uint *)(local_190 + lVar24 * 4 + 6);
      pGVar19 = (context->scene->geometries).items[local_318].ptr;
      uVar62 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                               local_200 *
                               pGVar19[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      local_3e8 = pGVar19->fnumTimeSegments;
      fVar135 = (pGVar19->time_range).lower;
      fVar72 = (((ray->dir).field_0.m128[3] - fVar135) / ((pGVar19->time_range).upper - fVar135)) *
               local_3e8;
      fVar135 = floorf(fVar72);
      if (local_3e8 + -1.0 <= fVar135) {
        fVar135 = local_3e8 + -1.0;
      }
      fVar101 = 0.0;
      if (0.0 <= fVar135) {
        fVar101 = fVar135;
      }
      _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar55 = (long)(int)fVar101 * 0x38;
      lVar60 = *(long *)(_Var20 + 0x10 + lVar55);
      lVar21 = *(long *)(_Var20 + 0x38 + lVar55);
      lVar22 = *(long *)(_Var20 + 0x48 + lVar55);
      pfVar1 = (float *)(lVar21 + lVar22 * uVar62);
      lVar24 = uVar62 + 1;
      pfVar2 = (float *)(lVar21 + lVar22 * lVar24);
      p_Var23 = pGVar19[4].occlusionFilterN;
      pfVar3 = (float *)(*(long *)(_Var20 + lVar55) + lVar60 * uVar62);
      auVar61 = (undefined1  [8])(*(long *)(p_Var23 + lVar55 + 0x10) * uVar62);
      pfVar4 = (float *)(*(long *)(_Var20 + lVar55) + lVar60 * lVar24);
      pfVar5 = (float *)(*(long *)(p_Var23 + lVar55 + 0x38) +
                        uVar62 * *(long *)(p_Var23 + lVar55 + 0x48));
      fVar72 = fVar72 - fVar101;
      fVar101 = 1.0 - fVar72;
      pfVar6 = (float *)(*(long *)(p_Var23 + lVar55 + 0x38) +
                        *(long *)(p_Var23 + lVar55 + 0x48) * lVar24);
      local_248 = *pfVar3 * fVar101 + *pfVar1 * fVar72;
      fStack_244 = pfVar3[1] * fVar101 + pfVar1[1] * fVar72;
      fStack_240 = pfVar3[2] * fVar101 + pfVar1[2] * fVar72;
      fStack_23c = pfVar3[3] * fVar101 + pfVar1[3] * fVar72;
      pfVar1 = (float *)((long)&(((Geometry *)auVar61)->super_RefCount)._vptr_RefCount +
                        *(long *)(p_Var23 + lVar55));
      local_78 = *pfVar4 * fVar101 + *pfVar2 * fVar72;
      fStack_74 = pfVar4[1] * fVar101 + pfVar2[1] * fVar72;
      fStack_70 = pfVar4[2] * fVar101 + pfVar2[2] * fVar72;
      fStack_6c = pfVar4[3] * fVar101 + pfVar2[3] * fVar72;
      pfVar2 = (float *)(*(long *)(p_Var23 + lVar55) + *(long *)(p_Var23 + lVar55 + 0x10) * lVar24);
      fVar135 = *(float *)&pGVar19[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i;
      local_88 = (*pfVar1 * fVar101 + *pfVar5 * fVar72) * 0.33333334 + local_248;
      fStack_84 = (pfVar1[1] * fVar101 + pfVar5[1] * fVar72) * 0.33333334 + fStack_244;
      fStack_80 = (pfVar1[2] * fVar101 + pfVar5[2] * fVar72) * 0.33333334 + fStack_240;
      fStack_7c = (pfVar1[3] * fVar101 + pfVar5[3] * fVar72) * 0.33333334 + fStack_23c;
      local_98 = local_78 - (fVar101 * *pfVar2 + fVar72 * *pfVar6) * 0.33333334;
      fStack_94 = fStack_74 - (fVar101 * pfVar2[1] + fVar72 * pfVar6[1]) * 0.33333334;
      fStack_90 = fStack_70 - (fVar101 * pfVar2[2] + fVar72 * pfVar6[2]) * 0.33333334;
      fStack_8c = fStack_6c - (fVar101 * pfVar2[3] + fVar72 * pfVar6[3]) * 0.33333334;
      fVar72 = (ray->org).field_0.m128[0];
      fVar101 = (ray->org).field_0.m128[1];
      fVar102 = (ray->org).field_0.m128[2];
      fVar196 = local_248 - fVar72;
      fVar197 = fStack_244 - fVar101;
      fVar198 = fStack_240 - fVar102;
      fVar103 = (local_310->ray_space).vx.field_0.m128[0];
      fVar121 = (local_310->ray_space).vx.field_0.m128[1];
      fVar123 = (local_310->ray_space).vx.field_0.m128[2];
      fVar126 = (local_310->ray_space).vx.field_0.m128[3];
      fVar133 = (local_310->ray_space).vy.field_0.m128[0];
      fVar138 = (local_310->ray_space).vy.field_0.m128[1];
      fVar149 = (local_310->ray_space).vy.field_0.m128[2];
      fVar150 = (local_310->ray_space).vy.field_0.m128[3];
      fVar152 = (local_310->ray_space).vz.field_0.m128[0];
      fVar165 = (local_310->ray_space).vz.field_0.m128[1];
      fVar168 = (local_310->ray_space).vz.field_0.m128[2];
      fVar173 = (local_310->ray_space).vz.field_0.m128[3];
      local_1c8 = fVar196 * fVar103 + fVar197 * fVar133 + fVar198 * fVar152;
      local_68 = fVar196 * fVar121 + fVar197 * fVar138 + fVar198 * fVar165;
      fVar216 = fVar196 * fVar123 + fVar197 * fVar149 + fVar198 * fVar168;
      fVar198 = local_88 - fVar72;
      fVar203 = fStack_84 - fVar101;
      fVar205 = fStack_80 - fVar102;
      fVar197 = fVar198 * fVar103 + fVar203 * fVar133 + fVar205 * fVar152;
      local_1d8 = fVar198 * fVar121 + fVar203 * fVar138 + fVar205 * fVar165;
      fVar196 = fVar198 * fVar123 + fVar203 * fVar149 + fVar205 * fVar168;
      fStack_3dc = fVar198 * fVar126 + fVar203 * fVar150 + fVar205 * fVar173;
      fVar205 = local_98 - fVar72;
      fVar208 = fStack_94 - fVar101;
      fVar215 = fStack_90 - fVar102;
      local_368 = fVar205 * fVar103 + fVar208 * fVar133 + fVar215 * fVar152;
      fVar198 = fVar205 * fVar121 + fVar208 * fVar138 + fVar215 * fVar165;
      fVar203 = fVar205 * fVar123 + fVar208 * fVar149 + fVar215 * fVar168;
      fStack_36c = fVar205 * fVar126 + fVar208 * fVar150 + fVar215 * fVar173;
      fVar72 = local_78 - fVar72;
      fVar101 = fStack_74 - fVar101;
      fVar102 = fStack_70 - fVar102;
      local_328 = fVar72 * fVar103 + fVar101 * fVar133 + fVar102 * fVar152;
      fVar103 = fVar72 * fVar121 + fVar101 * fVar138 + fVar102 * fVar165;
      fVar121 = fVar72 * fVar123 + fVar101 * fVar149 + fVar102 * fVar168;
      fStack_37c = fVar72 * fVar126 + fVar101 * fVar150 + fVar102 * fVar173;
      auVar226._0_8_ = CONCAT44(local_68,local_1c8) & 0x7fffffff7fffffff;
      auVar226._8_4_ = ABS(fVar216);
      auVar226._12_4_ = ABS(fStack_23c);
      auVar155._0_8_ = CONCAT44(local_1d8,fVar197) & 0x7fffffff7fffffff;
      auVar155._8_4_ = ABS(fVar196);
      auVar155._12_4_ = ABS(fStack_7c);
      auVar129 = maxps(auVar226,auVar155);
      auVar190._0_8_ = CONCAT44(fVar198,local_368) & 0x7fffffff7fffffff;
      auVar190._8_4_ = ABS(fVar203);
      auVar190._12_4_ = ABS(fStack_8c);
      auVar116._0_8_ = CONCAT44(fVar103,local_328) & 0x7fffffff7fffffff;
      auVar116._8_4_ = ABS(fVar121);
      auVar116._12_4_ = ABS(fStack_6c);
      auVar74 = maxps(auVar190,auVar116);
      auVar74 = maxps(auVar129,auVar74);
      fVar72 = auVar74._4_4_;
      if (auVar74._4_4_ <= auVar74._0_4_) {
        fVar72 = auVar74._0_4_;
      }
      auVar227._8_8_ = auVar74._8_8_;
      auVar227._0_8_ = auVar74._8_8_;
      fVar101 = (float)(int)fVar135;
      _local_1f8 = ZEXT416((uint)fVar101);
      if (auVar74._8_4_ <= fVar72) {
        auVar227._0_4_ = fVar72;
      }
      local_3d8._4_4_ = -(uint)(1.0 < fVar101);
      local_3d8._0_4_ = -(uint)(0.0 < fVar101);
      uStack_3d0._0_4_ = (float)-(uint)(2.0 < fVar101);
      uStack_3d0._4_4_ = -(uint)(3.0 < fVar101);
      pRVar58 = (RTCIntersectArguments *)((long)(int)fVar135 * 0x40);
      lVar24 = (long)(int)fVar135 * 0x44;
      pauVar9 = (undefined1 (*) [16])(bezier_basis0 + lVar24 + 0x908);
      fVar72 = *(float *)*pauVar9;
      fVar102 = *(float *)(bezier_basis0 + lVar24 + 0x90c);
      fVar123 = *(float *)(bezier_basis0 + lVar24 + 0x910);
      auVar31 = *(undefined1 (*) [12])*pauVar9;
      fVar126 = *(float *)(bezier_basis0 + lVar24 + 0x914);
      _local_398 = *pauVar9;
      fVar133 = *(float *)(bezier_basis0 + lVar24 + 0xd8c);
      fVar138 = *(float *)(bezier_basis0 + lVar24 + 0xd90);
      fVar149 = *(float *)(bezier_basis0 + lVar24 + 0xd94);
      fVar150 = *(float *)(bezier_basis0 + lVar24 + 0xd98);
      local_358 = *(float *)(bezier_basis0 + lVar24 + 0x484);
      fStack_354 = *(float *)(bezier_basis0 + lVar24 + 0x488);
      fStack_350 = *(float *)(bezier_basis0 + lVar24 + 0x48c);
      fStack_34c = *(float *)(bezier_basis0 + lVar24 + 0x490);
      local_268 = *(float *)(bezier_basis0 + lVar24);
      fStack_264 = *(float *)(bezier_basis0 + lVar24 + 4);
      fStack_260 = *(float *)(bezier_basis0 + lVar24 + 8);
      fStack_25c = *(float *)(bezier_basis0 + lVar24 + 0xc);
      local_348._0_4_ =
           local_1c8 * local_268 + fVar197 * local_358 + local_368 * fVar72 + local_328 * fVar133;
      local_348._4_4_ =
           local_1c8 * fStack_264 + fVar197 * fStack_354 + local_368 * fVar102 + local_328 * fVar138
      ;
      fStack_340 = local_1c8 * fStack_260 +
                   fVar197 * fStack_350 + local_368 * fVar123 + local_328 * fVar149;
      fStack_33c = local_1c8 * fStack_25c +
                   fVar197 * fStack_34c + local_368 * fVar126 + local_328 * fVar150;
      fVar279 = local_68 * local_268 + local_1d8 * local_358 + fVar198 * fVar72 + fVar103 * fVar133;
      fVar281 = local_68 * fStack_264 +
                local_1d8 * fStack_354 + fVar198 * fVar102 + fVar103 * fVar138;
      fVar283 = local_68 * fStack_260 +
                local_1d8 * fStack_350 + fVar198 * fVar123 + fVar103 * fVar149;
      fVar151 = local_68 * fStack_25c +
                local_1d8 * fStack_34c + fVar198 * fVar126 + fVar103 * fVar150;
      local_418._0_4_ =
           fStack_23c * local_268 + fStack_7c * local_358 + fStack_8c * fVar72 + fStack_6c * fVar133
      ;
      local_418._4_4_ =
           fStack_23c * fStack_264 +
           fStack_7c * fStack_354 + fStack_8c * fVar102 + fStack_6c * fVar138;
      uStack_410._0_4_ =
           fStack_23c * fStack_260 +
           fStack_7c * fStack_350 + fStack_8c * fVar123 + fStack_6c * fVar149;
      register0x000013cc =
           fStack_23c * fStack_25c +
           fStack_7c * fStack_34c + fStack_8c * fVar126 + fStack_6c * fVar150;
      fVar102 = *(float *)(bezier_basis1 + lVar24 + 0xd8c);
      fVar123 = *(float *)(bezier_basis1 + lVar24 + 0xd90);
      local_3b8 = *(RTCIntersectArguments **)(bezier_basis1 + lVar24 + 0xd8c);
      fStack_3b0 = *(float *)(bezier_basis1 + lVar24 + 0xd94);
      fStack_3ac = *(float *)(bezier_basis1 + lVar24 + 0xd98);
      local_278 = *(float *)(bezier_basis1 + lVar24 + 0x908);
      fStack_274 = *(float *)(bezier_basis1 + lVar24 + 0x90c);
      fStack_270 = *(float *)(bezier_basis1 + lVar24 + 0x910);
      fStack_26c = *(float *)(bezier_basis1 + lVar24 + 0x914);
      local_a8 = fStack_6c;
      fStack_a4 = fStack_6c;
      fStack_a0 = fStack_6c;
      fStack_9c = fStack_6c;
      local_58 = fStack_8c;
      fStack_54 = fStack_8c;
      fStack_50 = fStack_8c;
      fStack_4c = fStack_8c;
      fVar152 = *(float *)(bezier_basis1 + lVar24 + 0x484);
      fVar165 = *(float *)(bezier_basis1 + lVar24 + 0x488);
      fVar168 = *(float *)(bezier_basis1 + lVar24 + 0x48c);
      fVar173 = *(float *)(bezier_basis1 + lVar24 + 0x490);
      local_b8 = fStack_7c;
      fStack_b4 = fStack_7c;
      fStack_b0 = fStack_7c;
      fStack_ac = fStack_7c;
      fVar205 = *(float *)(bezier_basis1 + lVar24);
      fVar208 = *(float *)(bezier_basis1 + lVar24 + 4);
      fVar215 = *(float *)(bezier_basis1 + lVar24 + 8);
      fVar221 = *(float *)(bezier_basis1 + lVar24 + 0xc);
      fVar233 = local_1c8 * fVar205 +
                fVar197 * fVar152 + local_368 * local_278 + local_328 * fVar102;
      fVar241 = local_1c8 * fVar208 +
                fVar197 * fVar165 + local_368 * fStack_274 + local_328 * fVar123;
      fVar245 = local_1c8 * fVar215 +
                fVar197 * fVar168 + local_368 * fStack_270 + local_328 * fStack_3b0;
      fVar248 = local_1c8 * fVar221 +
                fVar197 * fVar173 + local_368 * fStack_26c + local_328 * fStack_3ac;
      fStack_64 = local_68;
      fStack_60 = local_68;
      fStack_5c = local_68;
      local_3c8 = local_68 * fVar205 + local_1d8 * fVar152 + fVar198 * local_278 + fVar103 * fVar102
      ;
      fStack_3c4 = local_68 * fVar208 +
                   local_1d8 * fVar165 + fVar198 * fStack_274 + fVar103 * fVar123;
      fStack_3c0 = local_68 * fVar215 +
                   local_1d8 * fVar168 + fVar198 * fStack_270 + fVar103 * fStack_3b0;
      fStack_3bc = local_68 * fVar221 +
                   local_1d8 * fVar173 + fVar198 * fStack_26c + fVar103 * fStack_3ac;
      local_c8 = fStack_23c;
      fStack_c4 = fStack_23c;
      fStack_c0 = fStack_23c;
      fStack_bc = fStack_23c;
      auVar228._0_4_ =
           fStack_23c * fVar205 + fStack_7c * fVar152 + fStack_8c * local_278 + fStack_6c * fVar102;
      auVar228._4_4_ =
           fStack_23c * fVar208 + fStack_7c * fVar165 + fStack_8c * fStack_274 + fStack_6c * fVar123
      ;
      auVar228._8_4_ =
           fStack_23c * fVar215 +
           fStack_7c * fVar168 + fStack_8c * fStack_270 + fStack_6c * fStack_3b0;
      auVar228._12_4_ =
           fStack_23c * fVar221 +
           fStack_7c * fVar173 + fStack_8c * fStack_26c + fStack_6c * fStack_3ac;
      local_338 = CONCAT44(fVar241,fVar233);
      uStack_330 = CONCAT44(fVar248,fVar245);
      fVar199 = fVar233 - (float)local_348._0_4_;
      fVar204 = fVar241 - (float)local_348._4_4_;
      fVar206 = fVar245 - fStack_340;
      fVar207 = fVar248 - fStack_33c;
      fVar153 = local_3c8 - fVar279;
      fVar166 = fStack_3c4 - fVar281;
      fVar169 = fStack_3c0 - fVar283;
      fVar171 = fStack_3bc - fVar151;
      local_258 = CONCAT44(fVar281,fVar279);
      uStack_250 = CONCAT44(fVar151,fVar283);
      fVar72 = fVar279 * fVar199 - (float)local_348._0_4_ * fVar153;
      fVar230 = fVar281 * fVar204 - (float)local_348._4_4_ * fVar166;
      fVar231 = fVar283 * fVar206 - fStack_340 * fVar169;
      fVar271 = fVar151 * fVar207 - fStack_33c * fVar171;
      auVar74 = maxps(_local_418,auVar228);
      bVar26 = fVar72 * fVar72 <=
               auVar74._0_4_ * auVar74._0_4_ * (fVar199 * fVar199 + fVar153 * fVar153) &&
               0.0 < fVar101;
      auVar144._0_4_ = -(uint)bVar26;
      bVar27 = fVar230 * fVar230 <=
               auVar74._4_4_ * auVar74._4_4_ * (fVar204 * fVar204 + fVar166 * fVar166) &&
               1.0 < fVar101;
      auVar144._4_4_ = -(uint)bVar27;
      bVar25 = fVar231 * fVar231 <=
               auVar74._8_4_ * auVar74._8_4_ * (fVar206 * fVar206 + fVar169 * fVar169) &&
               2.0 < fVar101;
      auVar144._8_4_ = -(uint)bVar25;
      bVar64 = fVar271 * fVar271 <=
               auVar74._12_4_ * auVar74._12_4_ * (fVar207 * fVar207 + fVar171 * fVar171) &&
               3.0 < fVar101;
      auVar144._12_4_ = -(uint)bVar64;
      local_2c8 = auVar227._0_4_;
      fStack_2c4 = auVar227._4_4_;
      fStack_2c0 = auVar227._8_4_;
      fStack_2bc = auVar227._12_4_;
      local_2c8 = local_2c8 * 4.7683716e-07;
      iVar53 = movmskps(fVar135,auVar144);
      fVar72 = (ray->org).field_0.m128[3];
      _local_1e8 = ZEXT416((uint)fVar72);
      fVar230 = fVar196;
      fVar231 = fVar196;
      fVar271 = fVar196;
      fVar218 = fVar197;
      fVar219 = fVar197;
      fVar220 = fVar197;
      fVar232 = fVar198;
      fVar240 = fVar198;
      fVar244 = fVar198;
      fVar250 = fVar103;
      fVar257 = fVar103;
      fVar258 = fVar103;
      fVar259 = fVar121;
      fVar260 = fVar121;
      fVar268 = fVar121;
      fVar269 = fVar203;
      fVar270 = fVar203;
      fVar272 = fVar203;
      local_408 = fVar197;
      fStack_404 = fVar197;
      fStack_400 = fVar197;
      fStack_3fc = fVar197;
      local_3f8 = fVar198;
      fStack_3f4 = fVar198;
      fStack_3f0 = fVar198;
      fStack_3ec = fVar198;
      fStack_3e0 = fVar196;
      local_3a8 = fVar103;
      fStack_3a4 = fVar103;
      fStack_3a0 = fVar103;
      fStack_39c = fVar103;
      fStack_380 = fVar121;
      fStack_370 = fVar203;
      fStack_364 = local_368;
      fStack_360 = local_368;
      fStack_35c = local_368;
      fStack_324 = local_328;
      fStack_320 = local_328;
      fStack_31c = local_328;
      fStack_1d4 = local_1d8;
      fStack_1d0 = local_1d8;
      fStack_1cc = local_1d8;
      fStack_1c4 = local_1c8;
      fStack_1c0 = local_1c8;
      fStack_1bc = local_1c8;
      if (iVar53 == 0) {
        bVar64 = false;
        fStack_3e4 = local_1d8;
        local_388 = local_328;
        fStack_384 = fVar103;
        local_378 = local_368;
        fStack_374 = fVar198;
      }
      else {
        fVar127 = fVar102 * fVar121 + local_278 * fVar203 + fVar152 * fVar196 + fVar205 * fVar216;
        fVar134 = fVar123 * fVar121 + fStack_274 * fVar203 + fVar165 * fVar196 + fVar208 * fVar216;
        fVar136 = fStack_3b0 * fVar121 + fStack_270 * fVar203 + fVar168 * fVar196 +
                  fVar215 * fVar216;
        fVar137 = fStack_3ac * fVar121 + fStack_26c * fVar203 + fVar173 * fVar196 +
                  fVar221 * fVar216;
        local_398._0_4_ = auVar31._0_4_;
        local_398._4_4_ = auVar31._4_4_;
        fStack_390 = auVar31._8_4_;
        fVar104 = fVar133 * fVar121 + (float)local_398._0_4_ * fVar203 + local_358 * fVar196 +
                  local_268 * fVar216;
        fVar122 = fVar138 * fVar121 + (float)local_398._4_4_ * fVar203 + fStack_354 * fVar196 +
                  fStack_264 * fVar216;
        fVar124 = fVar149 * fVar121 + fStack_390 * fVar203 + fStack_350 * fVar196 +
                  fStack_260 * fVar216;
        fVar125 = fVar150 * fVar121 + fVar126 * fVar203 + fStack_34c * fVar196 +
                  fStack_25c * fVar216;
        fVar102 = *(float *)(bezier_basis0 + lVar24 + 0x1210);
        fVar123 = *(float *)(bezier_basis0 + lVar24 + 0x1214);
        fVar126 = *(float *)(bezier_basis0 + lVar24 + 0x1218);
        fVar133 = *(float *)(bezier_basis0 + lVar24 + 0x121c);
        fVar138 = *(float *)(bezier_basis0 + lVar24 + 0x1694);
        fVar149 = *(float *)(bezier_basis0 + lVar24 + 0x1698);
        fVar150 = *(float *)(bezier_basis0 + lVar24 + 0x169c);
        fVar152 = *(float *)(bezier_basis0 + lVar24 + 0x16a0);
        fVar165 = *(float *)(bezier_basis0 + lVar24 + 0x1b18);
        fVar168 = *(float *)(bezier_basis0 + lVar24 + 0x1b1c);
        fVar173 = *(float *)(bezier_basis0 + lVar24 + 0x1b20);
        fVar205 = *(float *)(bezier_basis0 + lVar24 + 0x1b24);
        fVar208 = *(float *)(bezier_basis0 + lVar24 + 0x1f9c);
        fVar215 = *(float *)(bezier_basis0 + lVar24 + 0x1fa0);
        fVar221 = *(float *)(bezier_basis0 + lVar24 + 0x1fa4);
        fVar217 = *(float *)(bezier_basis0 + lVar24 + 0x1fa8);
        fVar234 = local_1c8 * fVar102 +
                  fVar197 * fVar138 + local_368 * fVar165 + local_328 * fVar208;
        fVar242 = local_1c8 * fVar123 +
                  fVar197 * fVar149 + local_368 * fVar168 + local_328 * fVar215;
        fVar246 = local_1c8 * fVar126 +
                  fVar197 * fVar150 + local_368 * fVar173 + local_328 * fVar221;
        fVar249 = local_1c8 * fVar133 +
                  fVar197 * fVar152 + local_368 * fVar205 + local_328 * fVar217;
        fVar293 = local_68 * fVar102 + local_1d8 * fVar138 + fVar198 * fVar165 + fVar103 * fVar208;
        fVar295 = local_68 * fVar123 + local_1d8 * fVar149 + fVar198 * fVar168 + fVar103 * fVar215;
        fVar297 = local_68 * fVar126 + local_1d8 * fVar150 + fVar198 * fVar173 + fVar103 * fVar221;
        fVar300 = local_68 * fVar133 + local_1d8 * fVar152 + fVar198 * fVar205 + fVar103 * fVar217;
        fVar235 = *(float *)(bezier_basis1 + lVar24 + 0x1210);
        fVar243 = *(float *)(bezier_basis1 + lVar24 + 0x1214);
        fVar247 = *(float *)(bezier_basis1 + lVar24 + 0x1218);
        fVar301 = *(float *)(bezier_basis1 + lVar24 + 0x121c);
        fVar273 = *(float *)(bezier_basis1 + lVar24 + 0x1b18);
        fVar280 = *(float *)(bezier_basis1 + lVar24 + 0x1b1c);
        fVar282 = *(float *)(bezier_basis1 + lVar24 + 0x1b20);
        fVar284 = *(float *)(bezier_basis1 + lVar24 + 0x1b24);
        fVar294 = *(float *)(bezier_basis1 + lVar24 + 0x1f9c);
        fVar296 = *(float *)(bezier_basis1 + lVar24 + 0x1fa0);
        fVar298 = *(float *)(bezier_basis1 + lVar24 + 0x1fa4);
        fVar302 = *(float *)(bezier_basis1 + lVar24 + 0x1fa8);
        fVar299 = *(float *)(bezier_basis1 + lVar24 + 0x1694);
        fVar303 = *(float *)(bezier_basis1 + lVar24 + 0x1698);
        fVar290 = *(float *)(bezier_basis1 + lVar24 + 0x169c);
        fVar292 = *(float *)(bezier_basis1 + lVar24 + 0x16a0);
        fVar285 = local_1c8 * fVar235 +
                  fVar197 * fVar299 + local_368 * fVar273 + local_328 * fVar294;
        fVar288 = local_1c8 * fVar243 +
                  fVar197 * fVar303 + local_368 * fVar280 + local_328 * fVar296;
        fVar289 = local_1c8 * fVar247 +
                  fVar197 * fVar290 + local_368 * fVar282 + local_328 * fVar298;
        fVar291 = local_1c8 * fVar301 +
                  fVar197 * fVar292 + local_368 * fVar284 + local_328 * fVar302;
        fVar154 = local_68 * fVar235 + local_1d8 * fVar299 + fVar198 * fVar273 + fVar103 * fVar294;
        fVar167 = local_68 * fVar243 + local_1d8 * fVar303 + fVar198 * fVar280 + fVar103 * fVar296;
        fVar170 = local_68 * fVar247 + local_1d8 * fVar290 + fVar198 * fVar282 + fVar103 * fVar298;
        fVar172 = local_68 * fVar301 + local_1d8 * fVar292 + fVar198 * fVar284 + fVar103 * fVar302;
        auVar266._0_8_ = CONCAT44(fVar242,fVar234) & 0x7fffffff7fffffff;
        auVar266._8_4_ = ABS(fVar246);
        auVar266._12_4_ = ABS(fVar249);
        auVar28._8_4_ = ABS(fVar297);
        auVar28._0_8_ = CONCAT44(fVar295,fVar293) & 0x7fffffff7fffffff;
        auVar28._12_4_ = ABS(fVar300);
        auVar74 = maxps(auVar266,auVar28);
        auVar274._0_8_ =
             CONCAT44(fVar123 * fVar216 + fVar149 * fVar196 + fVar168 * fVar203 + fVar215 * fVar121,
                      fVar102 * fVar216 + fVar138 * fVar196 + fVar165 * fVar203 + fVar208 * fVar121)
             & 0x7fffffff7fffffff;
        auVar274._8_4_ =
             ABS(fVar126 * fVar216 + fVar150 * fVar196 + fVar173 * fVar203 + fVar221 * fVar121);
        auVar274._12_4_ =
             ABS(fVar133 * fVar216 + fVar152 * fVar196 + fVar205 * fVar203 + fVar217 * fVar121);
        auVar74 = maxps(auVar74,auVar274);
        uVar66 = -(uint)(local_2c8 <= auVar74._0_4_);
        uVar67 = -(uint)(local_2c8 <= auVar74._4_4_);
        uVar68 = -(uint)(local_2c8 <= auVar74._8_4_);
        uVar69 = -(uint)(local_2c8 <= auVar74._12_4_);
        fVar149 = (float)((uint)fVar234 & uVar66 | ~uVar66 & (uint)fVar199);
        fVar152 = (float)((uint)fVar242 & uVar67 | ~uVar67 & (uint)fVar204);
        fVar208 = (float)((uint)fVar246 & uVar68 | ~uVar68 & (uint)fVar206);
        fVar215 = (float)((uint)fVar249 & uVar69 | ~uVar69 & (uint)fVar207);
        fVar138 = (float)(~uVar66 & (uint)fVar153 | (uint)fVar293 & uVar66);
        fVar150 = (float)(~uVar67 & (uint)fVar166 | (uint)fVar295 & uVar67);
        fVar221 = (float)(~uVar68 & (uint)fVar169 | (uint)fVar297 & uVar68);
        fVar217 = (float)(~uVar69 & (uint)fVar171 | (uint)fVar300 & uVar69);
        auVar275._0_8_ = CONCAT44(fVar288,fVar285) & 0x7fffffff7fffffff;
        auVar275._8_4_ = ABS(fVar289);
        auVar275._12_4_ = ABS(fVar291);
        auVar229._0_8_ = CONCAT44(fVar167,fVar154) & 0x7fffffff7fffffff;
        auVar229._8_4_ = ABS(fVar170);
        auVar229._12_4_ = ABS(fVar172);
        auVar74 = maxps(auVar275,auVar229);
        auVar201._0_8_ =
             CONCAT44(fVar243 * fVar216 + fVar303 * fVar196 + fVar280 * fVar203 + fVar296 * fVar121,
                      fVar235 * fVar216 + fVar299 * fVar196 + fVar273 * fVar203 + fVar294 * fVar121)
             & 0x7fffffff7fffffff;
        auVar201._8_4_ =
             ABS(fVar247 * fVar216 + fVar290 * fVar196 + fVar282 * fVar203 + fVar298 * fVar121);
        auVar201._12_4_ =
             ABS(fVar301 * fVar216 + fVar292 * fVar196 + fVar284 * fVar203 + fVar302 * fVar121);
        auVar74 = maxps(auVar74,auVar201);
        uVar66 = -(uint)(local_2c8 <= auVar74._0_4_);
        uVar67 = -(uint)(local_2c8 <= auVar74._4_4_);
        uVar68 = -(uint)(local_2c8 <= auVar74._8_4_);
        uVar69 = -(uint)(local_2c8 <= auVar74._12_4_);
        fVar199 = (float)((uint)fVar285 & uVar66 | ~uVar66 & (uint)fVar199);
        fVar235 = (float)((uint)fVar288 & uVar67 | ~uVar67 & (uint)fVar204);
        fVar243 = (float)((uint)fVar289 & uVar68 | ~uVar68 & (uint)fVar206);
        fVar247 = (float)((uint)fVar291 & uVar69 | ~uVar69 & (uint)fVar207);
        auVar156._0_4_ = (uint)fVar154 & uVar66;
        auVar156._4_4_ = (uint)fVar167 & uVar67;
        auVar156._8_4_ = (uint)fVar170 & uVar68;
        auVar156._12_4_ = (uint)fVar172 & uVar69;
        auVar276._0_4_ = ~uVar66 & (uint)fVar153;
        auVar276._4_4_ = ~uVar67 & (uint)fVar166;
        auVar276._8_4_ = ~uVar68 & (uint)fVar169;
        auVar276._12_4_ = ~uVar69 & (uint)fVar171;
        auVar276 = auVar276 | auVar156;
        auVar117._0_4_ = fVar138 * fVar138 + fVar149 * fVar149;
        auVar117._4_4_ = fVar150 * fVar150 + fVar152 * fVar152;
        auVar117._8_4_ = fVar221 * fVar221 + fVar208 * fVar208;
        auVar117._12_4_ = fVar217 * fVar217 + fVar215 * fVar215;
        auVar74 = rsqrtps(auVar156,auVar117);
        fVar102 = auVar74._0_4_;
        fVar123 = auVar74._4_4_;
        fVar126 = auVar74._8_4_;
        fVar133 = auVar74._12_4_;
        auVar157._0_4_ = fVar102 * fVar102 * auVar117._0_4_ * 0.5 * fVar102;
        auVar157._4_4_ = fVar123 * fVar123 * auVar117._4_4_ * 0.5 * fVar123;
        auVar157._8_4_ = fVar126 * fVar126 * auVar117._8_4_ * 0.5 * fVar126;
        auVar157._12_4_ = fVar133 * fVar133 * auVar117._12_4_ * 0.5 * fVar133;
        fVar204 = fVar102 * 1.5 - auVar157._0_4_;
        fVar206 = fVar123 * 1.5 - auVar157._4_4_;
        fVar207 = fVar126 * 1.5 - auVar157._8_4_;
        fVar301 = fVar133 * 1.5 - auVar157._12_4_;
        fVar153 = auVar276._0_4_;
        fVar166 = auVar276._4_4_;
        fVar169 = auVar276._8_4_;
        fVar171 = auVar276._12_4_;
        auVar118._0_4_ = fVar153 * fVar153 + fVar199 * fVar199;
        auVar118._4_4_ = fVar166 * fVar166 + fVar235 * fVar235;
        auVar118._8_4_ = fVar169 * fVar169 + fVar243 * fVar243;
        auVar118._12_4_ = fVar171 * fVar171 + fVar247 * fVar247;
        auVar74 = rsqrtps(auVar157,auVar118);
        fVar102 = auVar74._0_4_;
        fVar123 = auVar74._4_4_;
        fVar126 = auVar74._8_4_;
        fVar133 = auVar74._12_4_;
        fVar165 = fVar102 * 1.5 - fVar102 * fVar102 * auVar118._0_4_ * 0.5 * fVar102;
        fVar168 = fVar123 * 1.5 - fVar123 * fVar123 * auVar118._4_4_ * 0.5 * fVar123;
        fVar173 = fVar126 * 1.5 - fVar126 * fVar126 * auVar118._8_4_ * 0.5 * fVar126;
        fVar205 = fVar133 * 1.5 - fVar133 * fVar133 * auVar118._12_4_ * 0.5 * fVar133;
        fVar102 = fVar138 * fVar204 * (float)local_418._0_4_;
        fVar126 = fVar150 * fVar206 * (float)local_418._4_4_;
        fVar138 = fVar221 * fVar207 * (float)uStack_410;
        fVar150 = fVar217 * fVar301 * register0x000013cc;
        local_278 = (float)local_348._0_4_ + fVar102;
        fStack_274 = (float)local_348._4_4_ + fVar126;
        fStack_270 = fStack_340 + fVar138;
        fStack_26c = fStack_33c + fVar150;
        fVar123 = -fVar149 * fVar204 * (float)local_418._0_4_;
        fVar133 = -fVar152 * fVar206 * (float)local_418._4_4_;
        fVar149 = -fVar208 * fVar207 * (float)uStack_410;
        fVar152 = -fVar215 * fVar301 * register0x000013cc;
        local_268 = fVar279 + fVar123;
        fStack_264 = fVar281 + fVar133;
        fStack_260 = fVar283 + fVar149;
        fStack_25c = fVar151 + fVar152;
        fVar294 = fVar204 * 0.0 * (float)local_418._0_4_;
        fVar296 = fVar206 * 0.0 * (float)local_418._4_4_;
        fVar298 = fVar207 * 0.0 * (float)uStack_410;
        fVar302 = fVar301 * 0.0 * register0x000013cc;
        local_358 = fVar104 + fVar294;
        fStack_354 = fVar122 + fVar296;
        fStack_350 = fVar124 + fVar298;
        fStack_34c = fVar125 + fVar302;
        fVar273 = fVar153 * fVar165 * auVar228._0_4_;
        fVar280 = fVar166 * fVar168 * auVar228._4_4_;
        fVar282 = fVar169 * fVar173 * auVar228._8_4_;
        fVar284 = fVar171 * fVar205 * auVar228._12_4_;
        fVar204 = fVar233 + fVar273;
        fVar206 = fVar241 + fVar280;
        fVar207 = fVar245 + fVar282;
        fVar217 = fVar248 + fVar284;
        fVar208 = -fVar199 * fVar165 * auVar228._0_4_;
        fVar215 = -fVar235 * fVar168 * auVar228._4_4_;
        fVar221 = -fVar243 * fVar173 * auVar228._8_4_;
        fVar153 = -fVar247 * fVar205 * auVar228._12_4_;
        fVar166 = local_3c8 + fVar208;
        fVar169 = fStack_3c4 + fVar215;
        fVar171 = fStack_3c0 + fVar221;
        fVar199 = fStack_3bc + fVar153;
        fVar165 = fVar165 * 0.0 * auVar228._0_4_;
        fVar168 = fVar168 * 0.0 * auVar228._4_4_;
        fVar173 = fVar173 * 0.0 * auVar228._8_4_;
        fVar205 = fVar205 * 0.0 * auVar228._12_4_;
        fVar102 = (float)local_348._0_4_ - fVar102;
        fVar126 = (float)local_348._4_4_ - fVar126;
        fVar138 = fStack_340 - fVar138;
        fVar150 = fStack_33c - fVar150;
        fVar235 = fVar127 + fVar165;
        fVar243 = fVar134 + fVar168;
        fVar247 = fVar136 + fVar173;
        fVar301 = fVar137 + fVar205;
        fVar279 = fVar279 - fVar123;
        fVar281 = fVar281 - fVar133;
        fVar283 = fVar283 - fVar149;
        fVar151 = fVar151 - fVar152;
        fVar104 = fVar104 - fVar294;
        fVar122 = fVar122 - fVar296;
        fVar124 = fVar124 - fVar298;
        fVar125 = fVar125 - fVar302;
        uVar66 = -(uint)(0.0 < (fVar279 * (fVar235 - fVar104) - fVar104 * (fVar166 - fVar279)) * 0.0
                               + (fVar104 * (fVar204 - fVar102) - (fVar235 - fVar104) * fVar102) *
                                 0.0 + ((fVar166 - fVar279) * fVar102 -
                                       (fVar204 - fVar102) * fVar279));
        uVar67 = -(uint)(0.0 < (fVar281 * (fVar243 - fVar122) - fVar122 * (fVar169 - fVar281)) * 0.0
                               + (fVar122 * (fVar206 - fVar126) - (fVar243 - fVar122) * fVar126) *
                                 0.0 + ((fVar169 - fVar281) * fVar126 -
                                       (fVar206 - fVar126) * fVar281));
        uVar68 = -(uint)(0.0 < (fVar283 * (fVar247 - fVar124) - fVar124 * (fVar171 - fVar283)) * 0.0
                               + (fVar124 * (fVar207 - fVar138) - (fVar247 - fVar124) * fVar138) *
                                 0.0 + ((fVar171 - fVar283) * fVar138 -
                                       (fVar207 - fVar138) * fVar283));
        uVar69 = -(uint)(0.0 < (fVar151 * (fVar301 - fVar125) - fVar125 * (fVar199 - fVar151)) * 0.0
                               + (fVar125 * (fVar217 - fVar150) - (fVar301 - fVar125) * fVar150) *
                                 0.0 + ((fVar199 - fVar151) * fVar150 -
                                       (fVar217 - fVar150) * fVar151));
        fVar294 = (float)((uint)(fVar233 - fVar273) & uVar66 | ~uVar66 & (uint)local_278);
        fVar296 = (float)((uint)(fVar241 - fVar280) & uVar67 | ~uVar67 & (uint)fStack_274);
        fVar298 = (float)((uint)(fVar245 - fVar282) & uVar68 | ~uVar68 & (uint)fStack_270);
        fVar284 = (float)((uint)(fVar248 - fVar284) & uVar69 | ~uVar69 & (uint)fStack_26c);
        local_3c8 = (float)((uint)(local_3c8 - fVar208) & uVar66 | ~uVar66 & (uint)local_268);
        fStack_3c4 = (float)((uint)(fStack_3c4 - fVar215) & uVar67 | ~uVar67 & (uint)fStack_264);
        fStack_3c0 = (float)((uint)(fStack_3c0 - fVar221) & uVar68 | ~uVar68 & (uint)fStack_260);
        fStack_3bc = (float)((uint)(fStack_3bc - fVar153) & uVar69 | ~uVar69 & (uint)fStack_25c);
        fVar165 = (float)((uint)(fVar127 - fVar165) & uVar66 | ~uVar66 & (uint)local_358);
        fVar168 = (float)((uint)(fVar134 - fVar168) & uVar67 | ~uVar67 & (uint)fStack_354);
        fVar173 = (float)((uint)(fVar136 - fVar173) & uVar68 | ~uVar68 & (uint)fStack_350);
        fVar205 = (float)((uint)(fVar137 - fVar205) & uVar69 | ~uVar69 & (uint)fStack_34c);
        fVar123 = (float)((uint)fVar102 & uVar66 | ~uVar66 & (uint)fVar204);
        fVar133 = (float)((uint)fVar126 & uVar67 | ~uVar67 & (uint)fVar206);
        fVar149 = (float)((uint)fVar138 & uVar68 | ~uVar68 & (uint)fVar207);
        fVar152 = (float)((uint)fVar150 & uVar69 | ~uVar69 & (uint)fVar217);
        fVar208 = (float)((uint)fVar279 & uVar66 | ~uVar66 & (uint)fVar166);
        fVar215 = (float)((uint)fVar281 & uVar67 | ~uVar67 & (uint)fVar169);
        fVar221 = (float)((uint)fVar283 & uVar68 | ~uVar68 & (uint)fVar171);
        fVar153 = (float)((uint)fVar151 & uVar69 | ~uVar69 & (uint)fVar199);
        fVar248 = (float)((uint)fVar104 & uVar66 | ~uVar66 & (uint)fVar235);
        fVar273 = (float)((uint)fVar122 & uVar67 | ~uVar67 & (uint)fVar243);
        fVar280 = (float)((uint)fVar124 & uVar68 | ~uVar68 & (uint)fVar247);
        fVar282 = (float)((uint)fVar125 & uVar69 | ~uVar69 & (uint)fVar301);
        fVar204 = (float)((uint)fVar204 & uVar66 | ~uVar66 & (uint)fVar102) - fVar294;
        fVar206 = (float)((uint)fVar206 & uVar67 | ~uVar67 & (uint)fVar126) - fVar296;
        fVar207 = (float)((uint)fVar207 & uVar68 | ~uVar68 & (uint)fVar138) - fVar298;
        fVar233 = (float)((uint)fVar217 & uVar69 | ~uVar69 & (uint)fVar150) - fVar284;
        fVar279 = (float)((uint)fVar166 & uVar66 | ~uVar66 & (uint)fVar279) - local_3c8;
        fVar281 = (float)((uint)fVar169 & uVar67 | ~uVar67 & (uint)fVar281) - fStack_3c4;
        fVar283 = (float)((uint)fVar171 & uVar68 | ~uVar68 & (uint)fVar283) - fStack_3c0;
        fVar151 = (float)((uint)fVar199 & uVar69 | ~uVar69 & (uint)fVar151) - fStack_3bc;
        fVar241 = (float)((uint)fVar235 & uVar66 | ~uVar66 & (uint)fVar104) - fVar165;
        fVar245 = (float)((uint)fVar243 & uVar67 | ~uVar67 & (uint)fVar122) - fVar168;
        fStack_3b0 = (float)((uint)fVar247 & uVar68 | ~uVar68 & (uint)fVar124) - fVar173;
        fStack_3ac = (float)((uint)fVar301 & uVar69 | ~uVar69 & (uint)fVar125) - fVar205;
        fVar301 = fVar294 - fVar123;
        fVar302 = fVar296 - fVar133;
        fVar299 = fVar298 - fVar149;
        fVar303 = fVar284 - fVar152;
        fVar166 = local_3c8 - fVar208;
        fVar169 = fStack_3c4 - fVar215;
        fVar171 = fStack_3c0 - fVar221;
        fVar199 = fStack_3bc - fVar153;
        local_3b8 = (RTCIntersectArguments *)CONCAT44(fVar245,fVar241);
        fVar102 = fVar165 - fVar248;
        fVar126 = fVar168 - fVar273;
        fVar138 = fVar173 - fVar280;
        fVar150 = fVar205 - fVar282;
        fVar217 = (local_3c8 * fVar241 - fVar165 * fVar279) * 0.0 +
                  (fVar165 * fVar204 - fVar294 * fVar241) * 0.0 +
                  (fVar294 * fVar279 - local_3c8 * fVar204);
        fVar235 = (fStack_3c4 * fVar245 - fVar168 * fVar281) * 0.0 +
                  (fVar168 * fVar206 - fVar296 * fVar245) * 0.0 +
                  (fVar296 * fVar281 - fStack_3c4 * fVar206);
        auVar145._4_4_ = fVar235;
        auVar145._0_4_ = fVar217;
        fVar243 = (fStack_3c0 * fStack_3b0 - fVar173 * fVar283) * 0.0 +
                  (fVar173 * fVar207 - fVar298 * fStack_3b0) * 0.0 +
                  (fVar298 * fVar283 - fStack_3c0 * fVar207);
        fVar247 = (fStack_3bc * fStack_3ac - fVar205 * fVar151) * 0.0 +
                  (fVar205 * fVar233 - fVar284 * fStack_3ac) * 0.0 +
                  (fVar284 * fVar151 - fStack_3bc * fVar233);
        auVar286._0_4_ =
             (fVar208 * fVar102 - fVar248 * fVar166) * 0.0 +
             (fVar248 * fVar301 - fVar123 * fVar102) * 0.0 + (fVar123 * fVar166 - fVar208 * fVar301)
        ;
        auVar286._4_4_ =
             (fVar215 * fVar126 - fVar273 * fVar169) * 0.0 +
             (fVar273 * fVar302 - fVar133 * fVar126) * 0.0 + (fVar133 * fVar169 - fVar215 * fVar302)
        ;
        auVar286._8_4_ =
             (fVar221 * fVar138 - fVar280 * fVar171) * 0.0 +
             (fVar280 * fVar299 - fVar149 * fVar138) * 0.0 + (fVar149 * fVar171 - fVar221 * fVar299)
        ;
        auVar286._12_4_ =
             (fVar153 * fVar150 - fVar282 * fVar199) * 0.0 +
             (fVar282 * fVar303 - fVar152 * fVar150) * 0.0 + (fVar152 * fVar199 - fVar153 * fVar303)
        ;
        auVar145._8_4_ = fVar243;
        auVar145._12_4_ = fVar247;
        auVar74 = maxps(auVar145,auVar286);
        bVar26 = auVar74._0_4_ <= 0.0 && bVar26;
        auVar146._0_4_ = -(uint)bVar26;
        bVar27 = auVar74._4_4_ <= 0.0 && bVar27;
        auVar146._4_4_ = -(uint)bVar27;
        bVar25 = auVar74._8_4_ <= 0.0 && bVar25;
        auVar146._8_4_ = -(uint)bVar25;
        bVar64 = auVar74._12_4_ <= 0.0 && bVar64;
        auVar146._12_4_ = -(uint)bVar64;
        iVar53 = movmskps(iVar53,auVar146);
        if (iVar53 == 0) {
LAB_00c0a575:
          iVar53 = 0;
          auVar96._8_8_ = uStack_2f0;
          auVar96._0_8_ = local_2f8;
        }
        else {
          fVar123 = ray->tfar;
          auVar158._0_4_ = fVar102 * fVar279;
          auVar158._4_4_ = fVar126 * fVar281;
          auVar158._8_4_ = fVar138 * fVar283;
          auVar158._12_4_ = fVar150 * fVar151;
          fVar215 = fVar166 * fVar241 - auVar158._0_4_;
          fVar221 = fVar169 * fVar245 - auVar158._4_4_;
          fVar153 = fVar171 * fStack_3b0 - auVar158._8_4_;
          fVar248 = fVar199 * fStack_3ac - auVar158._12_4_;
          fVar102 = fVar102 * fVar204 - fVar241 * fVar301;
          fVar133 = fVar126 * fVar206 - fVar245 * fVar302;
          fVar149 = fVar138 * fVar207 - fStack_3b0 * fVar299;
          fVar152 = fVar150 * fVar233 - fStack_3ac * fVar303;
          fVar279 = fVar301 * fVar279 - fVar166 * fVar204;
          fVar281 = fVar302 * fVar281 - fVar169 * fVar206;
          fVar283 = fVar299 * fVar283 - fVar171 * fVar207;
          fVar151 = fVar303 * fVar151 - fVar199 * fVar233;
          auVar191._0_4_ = fVar215 * 0.0 + fVar102 * 0.0 + fVar279;
          auVar191._4_4_ = fVar221 * 0.0 + fVar133 * 0.0 + fVar281;
          auVar191._8_4_ = fVar153 * 0.0 + fVar149 * 0.0 + fVar283;
          auVar191._12_4_ = fVar248 * 0.0 + fVar152 * 0.0 + fVar151;
          auVar74 = rcpps(auVar158,auVar191);
          fVar126 = auVar74._0_4_;
          fVar138 = auVar74._4_4_;
          fVar150 = auVar74._8_4_;
          fVar208 = auVar74._12_4_;
          fVar126 = (1.0 - auVar191._0_4_ * fVar126) * fVar126 + fVar126;
          fVar138 = (1.0 - auVar191._4_4_ * fVar138) * fVar138 + fVar138;
          fVar150 = (1.0 - auVar191._8_4_ * fVar150) * fVar150 + fVar150;
          fVar208 = (1.0 - auVar191._12_4_ * fVar208) * fVar208 + fVar208;
          fVar102 = (fVar165 * fVar279 + local_3c8 * fVar102 + fVar294 * fVar215) * fVar126;
          fVar133 = (fVar168 * fVar281 + fStack_3c4 * fVar133 + fVar296 * fVar221) * fVar138;
          fVar149 = (fVar173 * fVar283 + fStack_3c0 * fVar149 + fVar298 * fVar153) * fVar150;
          fVar152 = (fVar205 * fVar151 + fStack_3bc * fVar152 + fVar284 * fVar248) * fVar208;
          bVar26 = (fVar102 <= fVar123 && fVar72 <= fVar102) && bVar26;
          auVar159._0_4_ = -(uint)bVar26;
          bVar27 = (fVar133 <= fVar123 && fVar72 <= fVar133) && bVar27;
          auVar159._4_4_ = -(uint)bVar27;
          bVar25 = (fVar149 <= fVar123 && fVar72 <= fVar149) && bVar25;
          auVar159._8_4_ = -(uint)bVar25;
          bVar64 = (fVar152 <= fVar123 && fVar72 <= fVar152) && bVar64;
          auVar159._12_4_ = -(uint)bVar64;
          iVar53 = movmskps(iVar53,auVar159);
          if (iVar53 == 0) goto LAB_00c0a575;
          auVar160._0_8_ =
               CONCAT44(-(uint)(auVar191._4_4_ != 0.0 && bVar27),
                        -(uint)(auVar191._0_4_ != 0.0 && bVar26));
          auVar160._8_4_ = -(uint)(auVar191._8_4_ != 0.0 && bVar25);
          auVar160._12_4_ = -(uint)(auVar191._12_4_ != 0.0 && bVar64);
          iVar53 = movmskps(iVar53,auVar160);
          auVar96._8_8_ = uStack_2f0;
          auVar96._0_8_ = local_2f8;
          if (iVar53 != 0) {
            fVar217 = fVar217 * fVar126;
            fVar235 = fVar235 * fVar138;
            fVar243 = fVar243 * fVar150;
            fVar247 = fVar247 * fVar208;
            local_2d8 = (float)((uint)(1.0 - fVar217) & uVar66 | ~uVar66 & (uint)fVar217);
            fStack_2d4 = (float)((uint)(1.0 - fVar235) & uVar67 | ~uVar67 & (uint)fVar235);
            fStack_2d0 = (float)((uint)(1.0 - fVar243) & uVar68 | ~uVar68 & (uint)fVar243);
            fStack_2cc = (float)((uint)(1.0 - fVar247) & uVar69 | ~uVar69 & (uint)fVar247);
            local_1a8 = (float)(~uVar66 & (uint)(auVar286._0_4_ * fVar126) |
                               (uint)(1.0 - auVar286._0_4_ * fVar126) & uVar66);
            fStack_1a4 = (float)(~uVar67 & (uint)(auVar286._4_4_ * fVar138) |
                                (uint)(1.0 - auVar286._4_4_ * fVar138) & uVar67);
            fStack_1a0 = (float)(~uVar68 & (uint)(auVar286._8_4_ * fVar150) |
                                (uint)(1.0 - auVar286._8_4_ * fVar150) & uVar68);
            fStack_19c = (float)(~uVar69 & (uint)(auVar286._12_4_ * fVar208) |
                                (uint)(1.0 - auVar286._12_4_ * fVar208) & uVar69);
            auVar96._8_4_ = auVar160._8_4_;
            auVar96._0_8_ = auVar160._0_8_;
            auVar96._12_4_ = auVar160._12_4_;
            local_2e8 = fVar102;
            fStack_2e4 = fVar133;
            fStack_2e0 = fVar149;
            fStack_2dc = fVar152;
          }
        }
        iVar53 = movmskps(iVar53,auVar96);
        fStack_3e4 = fVar196;
        fStack_3dc = fVar196;
        _local_3d8 = auVar228;
        _local_398 = auVar144;
        local_388 = fVar121;
        fStack_384 = fVar121;
        fStack_37c = fVar121;
        local_378 = fVar203;
        fStack_374 = fVar203;
        fStack_36c = fVar203;
        if (iVar53 == 0) {
          bVar64 = false;
        }
        else {
          fVar102 = (auVar228._0_4_ - (float)local_418._0_4_) * local_2d8 + (float)local_418._0_4_;
          fVar123 = (auVar228._4_4_ - (float)local_418._4_4_) * fStack_2d4 + (float)local_418._4_4_;
          fVar126 = (auVar228._8_4_ - (float)uStack_410) * fStack_2d0 + (float)uStack_410;
          fVar133 = (auVar228._12_4_ - register0x000013cc) * fStack_2cc + register0x000013cc;
          fVar72 = local_310->depth_scale;
          auVar119._0_4_ = -(uint)(fVar72 * (fVar102 + fVar102) < local_2e8) & auVar96._0_4_;
          auVar119._4_4_ = -(uint)(fVar72 * (fVar123 + fVar123) < fStack_2e4) & auVar96._4_4_;
          auVar119._8_4_ = -(uint)(fVar72 * (fVar126 + fVar126) < fStack_2e0) & auVar96._8_4_;
          auVar119._12_4_ = -(uint)(fVar72 * (fVar133 + fVar133) < fStack_2dc) & auVar96._12_4_;
          uVar66 = movmskps((int)local_310,auVar119);
          if (uVar66 != 0) {
            local_1a8 = local_1a8 + local_1a8 + -1.0;
            fStack_1a4 = fStack_1a4 + fStack_1a4 + -1.0;
            fStack_1a0 = fStack_1a0 + fStack_1a0 + -1.0;
            fStack_19c = fStack_19c + fStack_19c + -1.0;
            local_158 = 0;
            local_148 = CONCAT44(fStack_244,local_248);
            uStack_140 = CONCAT44(fStack_23c,fStack_240);
            local_138 = CONCAT44(fStack_84,local_88);
            uStack_130 = CONCAT44(fStack_7c,fStack_80);
            local_128 = CONCAT44(fStack_94,local_98);
            uStack_120 = CONCAT44(fStack_8c,fStack_90);
            local_118 = CONCAT44(fStack_74,local_78);
            uStack_110 = CONCAT44(fStack_6c,fStack_70);
            pRVar58 = (RTCIntersectArguments *)(ulong)(uint)ray->mask;
            local_188 = local_2d8;
            fStack_184 = fStack_2d4;
            fStack_180 = fStack_2d0;
            fStack_17c = fStack_2cc;
            local_178 = local_1a8;
            fStack_174 = fStack_1a4;
            fStack_170 = fStack_1a0;
            fStack_16c = fStack_19c;
            local_168 = local_2e8;
            fStack_164 = fStack_2e4;
            fStack_160 = fStack_2e0;
            fStack_15c = fStack_2dc;
            local_154 = fVar135;
            local_108 = auVar119;
            if ((pGVar19->mask & ray->mask) != 0) {
              pRVar58 = context->args;
              if ((pRVar58->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar64 = true, pGVar19->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar101 = 1.0 / fVar101;
                local_f8[0] = fVar101 * (local_2d8 + 0.0);
                local_f8[1] = fVar101 * (fStack_2d4 + 1.0);
                local_f8[2] = fVar101 * (fStack_2d0 + 2.0);
                local_f8[3] = fVar101 * (fStack_2cc + 3.0);
                local_e8 = CONCAT44(fStack_1a4,local_1a8);
                uStack_e0 = CONCAT44(fStack_19c,fStack_1a0);
                local_d8[0] = local_2e8;
                local_d8[1] = fStack_2e4;
                local_d8[2] = fStack_2e0;
                local_d8[3] = fStack_2dc;
                auVar61 = (undefined1  [8])(ulong)(uVar66 & 0xff);
                pRVar58 = (RTCIntersectArguments *)0x0;
                if (auVar61 != (undefined1  [8])0x0) {
                  for (; ((uVar66 & 0xff) >> (long)pRVar58 & 1) == 0;
                      pRVar58 = (RTCIntersectArguments *)((long)&pRVar58->flags + 1)) {
                  }
                }
                uStack_410 = uStack_130;
                local_418 = (undefined1  [8])local_138;
                uStack_3d0 = uStack_120;
                local_3d8 = (undefined1  [8])local_128;
                bVar64 = true;
                local_3e8 = fVar196;
                local_338 = local_118;
                uStack_330 = uStack_110;
                do {
                  local_22c = local_f8[(long)pRVar58];
                  local_228 = *(undefined4 *)((long)&local_e8 + (long)pRVar58 * 4);
                  local_3c8 = ray->tfar;
                  ray->tfar = local_d8[(long)pRVar58];
                  local_2b8.context = context->user;
                  fVar72 = 1.0 - local_22c;
                  fVar102 = local_22c * fVar72 + local_22c * fVar72;
                  fVar101 = fVar72 * fVar72 * -3.0;
                  fVar123 = (fVar72 * fVar72 - fVar102) * 3.0;
                  fVar72 = (fVar102 - local_22c * local_22c) * 3.0;
                  fVar102 = local_22c * local_22c * 3.0;
                  local_238 = CONCAT44(fVar101 * fStack_244 +
                                       fVar123 * (float)local_418._4_4_ +
                                       fVar72 * (float)local_3d8._4_4_ + fVar102 * local_338._4_4_,
                                       fVar101 * local_248 +
                                       fVar123 * (float)local_418._0_4_ +
                                       fVar72 * (float)local_3d8._0_4_ + fVar102 * (float)local_338)
                  ;
                  local_230 = fVar101 * fStack_240 +
                              fVar123 * (float)uStack_410 +
                              fVar72 * (float)uStack_3d0 + fVar102 * (float)uStack_330;
                  local_224 = (undefined4)local_200;
                  local_220 = (undefined4)local_318;
                  local_21c = (local_2b8.context)->instID[0];
                  local_218 = (local_2b8.context)->instPrimID[0];
                  local_41c = -1;
                  local_2b8.valid = &local_41c;
                  local_2b8.geometryUserPtr = pGVar19->userPtr;
                  local_2b8.hit = (RTCHitN *)&local_238;
                  local_2b8.N = 1;
                  local_3b8 = pRVar58;
                  local_2b8.ray = (RTCRayN *)ray;
                  if ((pGVar19->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar19->occlusionFilterN)(&local_2b8), fVar196 = local_3e8,
                     fVar230 = fStack_3e4, fVar231 = fStack_3e0, fVar271 = fStack_3dc,
                     fVar197 = local_408, fVar218 = fStack_404, fVar219 = fStack_400,
                     fVar220 = fStack_3fc, fVar198 = local_3f8, fVar232 = fStack_3f4,
                     fVar240 = fStack_3f0, fVar244 = fStack_3ec, fVar103 = local_3a8,
                     fVar250 = fStack_3a4, fVar257 = fStack_3a0, fVar258 = fStack_39c,
                     fVar121 = local_388, fVar259 = fStack_384, fVar260 = fStack_380,
                     fVar268 = fStack_37c, fVar203 = local_378, fVar269 = fStack_374,
                     fVar270 = fStack_370, fVar272 = fStack_36c, *local_2b8.valid != 0)) {
                    pRVar58 = context->args;
                    if (pRVar58->filter == (RTCFilterFunctionN)0x0) break;
                    if (((pRVar58->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar19->field_8).field_0x2 & 0x40) != 0)) {
                      (*pRVar58->filter)(&local_2b8);
                      fVar196 = local_3e8;
                      fVar230 = fStack_3e4;
                      fVar231 = fStack_3e0;
                      fVar271 = fStack_3dc;
                      fVar197 = local_408;
                      fVar218 = fStack_404;
                      fVar219 = fStack_400;
                      fVar220 = fStack_3fc;
                      fVar198 = local_3f8;
                      fVar232 = fStack_3f4;
                      fVar240 = fStack_3f0;
                      fVar244 = fStack_3ec;
                      fVar103 = local_3a8;
                      fVar250 = fStack_3a4;
                      fVar257 = fStack_3a0;
                      fVar258 = fStack_39c;
                      fVar121 = local_388;
                      fVar259 = fStack_384;
                      fVar260 = fStack_380;
                      fVar268 = fStack_37c;
                      fVar203 = local_378;
                      fVar269 = fStack_374;
                      fVar270 = fStack_370;
                      fVar272 = fStack_36c;
                    }
                    if (*local_2b8.valid != 0) break;
                  }
                  ray->tfar = local_3c8;
                  auVar61 = (undefined1  [8])((ulong)auVar61 ^ 1L << ((ulong)local_3b8 & 0x3f));
                  pRVar58 = (RTCIntersectArguments *)0x0;
                  if (auVar61 != (undefined1  [8])0x0) {
                    for (; ((ulong)auVar61 >> (long)pRVar58 & 1) == 0;
                        pRVar58 = (RTCIntersectArguments *)((long)&pRVar58->flags + 1)) {
                    }
                  }
                  bVar64 = auVar61 != (undefined1  [8])0x0;
                } while (bVar64);
              }
              goto LAB_00c096ae;
            }
          }
          bVar64 = false;
        }
      }
LAB_00c096ae:
      uVar57 = SUB84(pRVar58,0);
      if (4 < (int)fVar135) {
        local_1e8._4_4_ = local_1e8._0_4_;
        fStack_1e0 = (float)local_1e8._0_4_;
        fStack_1dc = (float)local_1e8._0_4_;
        local_1f8._4_4_ = 1.0 / (float)local_1f8._0_4_;
        local_1f8._0_4_ = local_1f8._4_4_;
        fStack_1f0 = (float)local_1f8._4_4_;
        fStack_1ec = (float)local_1f8._4_4_;
        lVar60 = 4;
        fStack_2c4 = local_2c8;
        fStack_2c0 = local_2c8;
        fStack_2bc = local_2c8;
        local_3e8 = fVar196;
        fStack_3e4 = fVar230;
        fStack_3e0 = fVar231;
        fStack_3dc = fVar271;
        local_388 = fVar121;
        fStack_384 = fVar259;
        fStack_380 = fVar260;
        fStack_37c = fVar268;
        local_378 = fVar203;
        fStack_374 = fVar269;
        fStack_370 = fVar270;
        fStack_36c = fVar272;
        local_278 = fVar135;
        fStack_274 = fVar135;
        fStack_270 = fVar135;
        fStack_26c = fVar135;
        do {
          uVar66 = (uint)lVar60;
          local_3c8 = (float)-(uint)((int)uVar66 < (int)local_278);
          bVar25 = (int)(uVar66 | 1) < (int)fStack_274;
          fStack_3c4 = (float)-(uint)bVar25;
          bVar26 = (int)(uVar66 | 2) < (int)fStack_270;
          fStack_3c0 = (float)-(uint)bVar26;
          bVar27 = (int)(uVar66 | 3) < (int)fStack_26c;
          fStack_3bc = (float)-(uint)bVar27;
          pRVar58 = (RTCIntersectArguments *)(bezier_basis0 + lVar24);
          pRVar7 = &pRVar58->flags + lVar60;
          fVar72 = (float)*pRVar7;
          fVar101 = (float)pRVar7[1];
          fVar102 = (float)pRVar7[2];
          auVar33 = *(undefined1 (*) [12])pRVar7;
          fVar121 = *(float *)*(undefined1 (*) [12])(pRVar7 + 3);
          pauVar9 = (undefined1 (*) [16])(lVar24 + 0x2227768 + lVar60 * 4);
          fVar123 = *(float *)*pauVar9;
          fVar126 = *(float *)(*pauVar9 + 4);
          fVar133 = *(float *)(*pauVar9 + 8);
          auVar32 = *(undefined1 (*) [12])*pauVar9;
          fVar138 = *(float *)(*pauVar9 + 0xc);
          _local_398 = *pauVar9;
          pfVar1 = (float *)(lVar24 + 0x2227bec + lVar60 * 4);
          local_358 = *pfVar1;
          fStack_354 = pfVar1[1];
          fStack_350 = pfVar1[2];
          fStack_34c = pfVar1[3];
          pauVar9 = (undefined1 (*) [16])(lVar24 + 0x2228070 + lVar60 * 4);
          fVar149 = *(float *)*pauVar9;
          fVar150 = *(float *)(*pauVar9 + 4);
          fVar152 = *(float *)(*pauVar9 + 8);
          auVar31 = *(undefined1 (*) [12])*pauVar9;
          fVar165 = *(float *)(*pauVar9 + 0xc);
          fVar221 = local_1c8 * fVar72 +
                    fVar197 * fVar123 + local_368 * local_358 + local_328 * fVar149;
          fVar230 = fStack_1c4 * fVar101 +
                    fVar218 * fVar126 + fStack_364 * fStack_354 + fStack_324 * fVar150;
          fVar231 = fStack_1c0 * fVar102 +
                    fVar219 * fVar133 + fStack_360 * fStack_350 + fStack_320 * fVar152;
          fVar271 = fStack_1bc * fVar121 +
                    fVar220 * fVar138 + fStack_35c * fStack_34c + fStack_31c * fVar165;
          fVar259 = local_68 * fVar72 +
                    local_1d8 * fVar123 + fVar198 * local_358 + fVar103 * fVar149;
          fVar260 = fStack_64 * fVar101 +
                    fStack_1d4 * fVar126 + fVar232 * fStack_354 + fVar250 * fVar150;
          fVar268 = fStack_60 * fVar102 +
                    fStack_1d0 * fVar133 + fVar240 * fStack_350 + fVar257 * fVar152;
          fVar269 = fStack_5c * fVar121 +
                    fStack_1cc * fVar138 + fVar244 * fStack_34c + fVar258 * fVar165;
          local_418._0_4_ =
               local_c8 * fVar72 + local_b8 * fVar123 + local_58 * local_358 + local_a8 * fVar149;
          local_418._4_4_ =
               fStack_c4 * fVar101 +
               fStack_b4 * fVar126 + fStack_54 * fStack_354 + fStack_a4 * fVar150;
          uStack_410._0_4_ =
               fStack_c0 * fVar102 +
               fStack_b0 * fVar133 + fStack_50 * fStack_350 + fStack_a0 * fVar152;
          register0x0000158c =
               fStack_bc * fVar121 +
               fStack_ac * fVar138 + fStack_4c * fStack_34c + fStack_9c * fVar165;
          pfVar1 = (float *)(bezier_basis1 + lVar24 + lVar60 * 4);
          fVar72 = *pfVar1;
          fVar101 = pfVar1[1];
          fVar102 = pfVar1[2];
          fVar123 = pfVar1[3];
          pfVar1 = (float *)(lVar24 + 0x2229b88 + lVar60 * 4);
          fVar126 = *pfVar1;
          fVar133 = pfVar1[1];
          fVar149 = pfVar1[2];
          fVar150 = pfVar1[3];
          pfVar1 = (float *)(lVar24 + 0x222a00c + lVar60 * 4);
          fVar152 = *pfVar1;
          fVar168 = pfVar1[1];
          fVar173 = pfVar1[2];
          fVar196 = pfVar1[3];
          pfVar1 = (float *)(lVar24 + 0x222a490 + lVar60 * 4);
          fVar203 = *pfVar1;
          fVar205 = pfVar1[1];
          fVar208 = pfVar1[2];
          fVar215 = pfVar1[3];
          fVar279 = local_1c8 * fVar72 +
                    fVar197 * fVar126 + local_368 * fVar152 + local_328 * fVar203;
          fVar281 = fStack_1c4 * fVar101 +
                    fVar218 * fVar133 + fStack_364 * fVar168 + fStack_324 * fVar205;
          fVar283 = fStack_1c0 * fVar102 +
                    fVar219 * fVar149 + fStack_360 * fVar173 + fStack_320 * fVar208;
          fVar151 = fStack_1bc * fVar123 +
                    fVar220 * fVar150 + fStack_35c * fVar196 + fStack_31c * fVar215;
          fVar270 = local_68 * fVar72 + local_1d8 * fVar126 + fVar198 * fVar152 + fVar103 * fVar203;
          fVar250 = fStack_64 * fVar101 +
                    fStack_1d4 * fVar133 + fVar232 * fVar168 + fVar250 * fVar205;
          fStack_3b0 = fStack_60 * fVar102 +
                       fStack_1d0 * fVar149 + fVar240 * fVar173 + fVar257 * fVar208;
          fStack_3ac = fStack_5c * fVar123 +
                       fStack_1cc * fVar150 + fVar244 * fVar196 + fVar258 * fVar215;
          auVar192._0_4_ =
               local_c8 * fVar72 + local_b8 * fVar126 + local_58 * fVar152 + local_a8 * fVar203;
          auVar192._4_4_ =
               fStack_c4 * fVar101 + fStack_b4 * fVar133 + fStack_54 * fVar168 + fStack_a4 * fVar205
          ;
          auVar192._8_4_ =
               fStack_c0 * fVar102 + fStack_b0 * fVar149 + fStack_50 * fVar173 + fStack_a0 * fVar208
          ;
          auVar192._12_4_ =
               fStack_bc * fVar123 + fStack_ac * fVar150 + fStack_4c * fVar196 + fStack_9c * fVar215
          ;
          fVar103 = fVar279 - fVar221;
          fVar197 = fVar281 - fVar230;
          fVar198 = fVar283 - fVar231;
          fVar218 = fVar151 - fVar271;
          local_3b8 = (RTCIntersectArguments *)CONCAT44(fVar250,fVar270);
          fVar244 = fVar270 - fVar259;
          fVar257 = fVar250 - fVar260;
          fVar258 = fStack_3b0 - fVar268;
          fVar272 = fStack_3ac - fVar269;
          local_258 = CONCAT44(fVar260,fVar259);
          uStack_250 = CONCAT44(fVar269,fVar268);
          local_338 = CONCAT44(fVar230,fVar221);
          uStack_330 = CONCAT44(fVar271,fVar231);
          fVar219 = fVar259 * fVar103 - fVar221 * fVar244;
          fVar220 = fVar260 * fVar197 - fVar230 * fVar257;
          fVar232 = fVar268 * fVar198 - fVar231 * fVar258;
          fVar240 = fVar269 * fVar218 - fVar271 * fVar272;
          auVar74 = maxps(_local_418,auVar192);
          bVar52 = fVar219 * fVar219 <=
                   auVar74._0_4_ * auVar74._0_4_ * (fVar103 * fVar103 + fVar244 * fVar244) &&
                   (int)uVar66 < (int)local_278;
          auVar214._0_4_ = -(uint)bVar52;
          bVar25 = fVar220 * fVar220 <=
                   auVar74._4_4_ * auVar74._4_4_ * (fVar197 * fVar197 + fVar257 * fVar257) && bVar25
          ;
          auVar214._4_4_ = -(uint)bVar25;
          bVar26 = fVar232 * fVar232 <=
                   auVar74._8_4_ * auVar74._8_4_ * (fVar198 * fVar198 + fVar258 * fVar258) && bVar26
          ;
          auVar214._8_4_ = -(uint)bVar26;
          bVar27 = fVar240 * fVar240 <=
                   auVar74._12_4_ * auVar74._12_4_ * (fVar218 * fVar218 + fVar272 * fVar272) &&
                   bVar27;
          auVar214._12_4_ = -(uint)bVar27;
          uVar67 = movmskps(SUB84(auVar61,0),auVar214);
          auVar61 = (undefined1  [8])(ulong)uVar67;
          _local_3d8 = *pauVar9;
          _local_348 = *(undefined1 (*) [16])pRVar7;
          if (uVar67 != 0) {
            fVar241 = fVar203 * local_388 + fVar152 * local_378 + fVar126 * local_3e8 +
                      fVar72 * fVar216;
            fVar245 = fVar205 * fStack_384 + fVar168 * fStack_374 + fVar133 * fStack_3e4 +
                      fVar101 * fVar216;
            fVar248 = fVar208 * fStack_380 + fVar173 * fStack_370 + fVar149 * fStack_3e0 +
                      fVar102 * fVar216;
            fVar217 = fVar215 * fStack_37c + fVar196 * fStack_36c + fVar150 * fStack_3dc +
                      fVar123 * fVar216;
            local_348._0_4_ = auVar33._0_4_;
            local_348._4_4_ = auVar33._4_4_;
            fStack_340 = auVar33._8_4_;
            local_398._0_4_ = auVar32._0_4_;
            local_398._4_4_ = auVar32._4_4_;
            fStack_390 = auVar32._8_4_;
            local_3d8._0_4_ = auVar31._0_4_;
            local_3d8._4_4_ = auVar31._4_4_;
            uStack_3d0._0_4_ = auVar31._8_4_;
            fVar273 = (float)local_3d8._0_4_ * local_388 + local_358 * local_378 +
                      (float)local_398._0_4_ * local_3e8 + (float)local_348._0_4_ * fVar216;
            fVar280 = (float)local_3d8._4_4_ * fStack_384 + fStack_354 * fStack_374 +
                      (float)local_398._4_4_ * fStack_3e4 + (float)local_348._4_4_ * fVar216;
            fVar282 = (float)uStack_3d0 * fStack_380 + fStack_350 * fStack_370 +
                      fStack_390 * fStack_3e0 + fStack_340 * fVar216;
            fVar284 = fVar165 * fStack_37c + fStack_34c * fStack_36c + fVar138 * fStack_3dc +
                      fVar121 * fVar216;
            pfVar1 = (float *)(lVar24 + 0x22284f4 + lVar60 * 4);
            fVar72 = *pfVar1;
            fVar101 = pfVar1[1];
            fVar102 = pfVar1[2];
            fVar121 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x2228978 + lVar60 * 4);
            fVar123 = *pfVar1;
            fVar126 = pfVar1[1];
            fVar133 = pfVar1[2];
            fVar138 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x2228dfc + lVar60 * 4);
            fVar149 = *pfVar1;
            fVar150 = pfVar1[1];
            fVar152 = pfVar1[2];
            fVar165 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x2229280 + lVar60 * 4);
            fVar168 = *pfVar1;
            fVar173 = pfVar1[1];
            fVar196 = pfVar1[2];
            fVar203 = pfVar1[3];
            fVar294 = local_1c8 * fVar72 +
                      local_408 * fVar123 + local_368 * fVar149 + local_328 * fVar168;
            fVar296 = fStack_1c4 * fVar101 +
                      fStack_404 * fVar126 + fStack_364 * fVar150 + fStack_324 * fVar173;
            fVar298 = fStack_1c0 * fVar102 +
                      fStack_400 * fVar133 + fStack_360 * fVar152 + fStack_320 * fVar196;
            fVar302 = fStack_1bc * fVar121 +
                      fStack_3fc * fVar138 + fStack_35c * fVar165 + fStack_31c * fVar203;
            fVar235 = local_68 * fVar72 +
                      local_1d8 * fVar123 + local_3f8 * fVar149 + local_3a8 * fVar168;
            fVar243 = fStack_64 * fVar101 +
                      fStack_1d4 * fVar126 + fStack_3f4 * fVar150 + fStack_3a4 * fVar173;
            fVar247 = fStack_60 * fVar102 +
                      fStack_1d0 * fVar133 + fStack_3f0 * fVar152 + fStack_3a0 * fVar196;
            fVar301 = fStack_5c * fVar121 +
                      fStack_1cc * fVar138 + fStack_3ec * fVar165 + fStack_39c * fVar203;
            pfVar1 = (float *)(lVar24 + 0x222a914 + lVar60 * 4);
            fVar205 = *pfVar1;
            fVar208 = pfVar1[1];
            fVar215 = pfVar1[2];
            fVar219 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x222b21c + lVar60 * 4);
            fVar220 = *pfVar1;
            fVar232 = pfVar1[1];
            fVar240 = pfVar1[2];
            fVar153 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x222b6a0 + lVar60 * 4);
            fVar166 = *pfVar1;
            fVar169 = pfVar1[1];
            fVar171 = pfVar1[2];
            fVar199 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x222ad98 + lVar60 * 4);
            fVar204 = *pfVar1;
            fVar206 = pfVar1[1];
            fVar207 = pfVar1[2];
            fVar233 = pfVar1[3];
            fVar299 = local_1c8 * fVar205 +
                      local_408 * fVar204 + local_368 * fVar220 + local_328 * fVar166;
            fVar303 = fStack_1c4 * fVar208 +
                      fStack_404 * fVar206 + fStack_364 * fVar232 + fStack_324 * fVar169;
            fVar290 = fStack_1c0 * fVar215 +
                      fStack_400 * fVar207 + fStack_360 * fVar240 + fStack_320 * fVar171;
            fVar292 = fStack_1bc * fVar219 +
                      fStack_3fc * fVar233 + fStack_35c * fVar153 + fStack_31c * fVar199;
            fVar104 = local_68 * fVar205 +
                      local_1d8 * fVar204 + local_3f8 * fVar220 + local_3a8 * fVar166;
            fVar122 = fStack_64 * fVar208 +
                      fStack_1d4 * fVar206 + fStack_3f4 * fVar232 + fStack_3a4 * fVar169;
            fVar124 = fStack_60 * fVar215 +
                      fStack_1d0 * fVar207 + fStack_3f0 * fVar240 + fStack_3a0 * fVar171;
            fVar125 = fStack_5c * fVar219 +
                      fStack_1cc * fVar233 + fStack_3ec * fVar153 + fStack_39c * fVar199;
            auVar267._0_8_ = CONCAT44(fVar296,fVar294) & 0x7fffffff7fffffff;
            auVar267._8_4_ = ABS(fVar298);
            auVar267._12_4_ = ABS(fVar302);
            auVar193._0_8_ = CONCAT44(fVar243,fVar235) & 0x7fffffff7fffffff;
            auVar193._8_4_ = ABS(fVar247);
            auVar193._12_4_ = ABS(fVar301);
            auVar74 = maxps(auVar267,auVar193);
            auVar277._0_8_ =
                 CONCAT44(fVar101 * fVar216 +
                          fVar126 * fStack_3e4 + fVar150 * fStack_374 + fVar173 * fStack_384,
                          fVar72 * fVar216 +
                          fVar123 * local_3e8 + fVar149 * local_378 + fVar168 * local_388) &
                 0x7fffffff7fffffff;
            auVar277._8_4_ =
                 ABS(fVar102 * fVar216 +
                     fVar133 * fStack_3e0 + fVar152 * fStack_370 + fVar196 * fStack_380);
            auVar277._12_4_ =
                 ABS(fVar121 * fVar216 +
                     fVar138 * fStack_3dc + fVar165 * fStack_36c + fVar203 * fStack_37c);
            auVar74 = maxps(auVar74,auVar277);
            uVar67 = -(uint)(local_2c8 <= auVar74._0_4_);
            uVar68 = -(uint)(fStack_2c4 <= auVar74._4_4_);
            uVar69 = -(uint)(fStack_2c0 <= auVar74._8_4_);
            uVar70 = -(uint)(fStack_2bc <= auVar74._12_4_);
            auVar194._0_4_ = ~uVar67 & (uint)fVar103;
            auVar194._4_4_ = ~uVar68 & (uint)fVar197;
            auVar194._8_4_ = ~uVar69 & (uint)fVar198;
            auVar194._12_4_ = ~uVar70 & (uint)fVar218;
            auVar256._0_4_ = (uint)fVar294 & uVar67;
            auVar256._4_4_ = (uint)fVar296 & uVar68;
            auVar256._8_4_ = (uint)fVar298 & uVar69;
            auVar256._12_4_ = (uint)fVar302 & uVar70;
            auVar256 = auVar256 | auVar194;
            fVar149 = (float)(~uVar67 & (uint)fVar244 | (uint)fVar235 & uVar67);
            fVar152 = (float)(~uVar68 & (uint)fVar257 | (uint)fVar243 & uVar68);
            fVar203 = (float)(~uVar69 & (uint)fVar258 | (uint)fVar247 & uVar69);
            fVar243 = (float)(~uVar70 & (uint)fVar272 | (uint)fVar301 & uVar70);
            auVar278._0_8_ = CONCAT44(fVar303,fVar299) & 0x7fffffff7fffffff;
            auVar278._8_4_ = ABS(fVar290);
            auVar278._12_4_ = ABS(fVar292);
            auVar130._0_8_ = CONCAT44(fVar122,fVar104) & 0x7fffffff7fffffff;
            auVar130._8_4_ = ABS(fVar124);
            auVar130._12_4_ = ABS(fVar125);
            auVar74 = maxps(auVar278,auVar130);
            auVar97._0_8_ =
                 CONCAT44(fVar208 * fVar216 +
                          fVar206 * fStack_3e4 + fVar232 * fStack_374 + fVar169 * fStack_384,
                          fVar205 * fVar216 +
                          fVar204 * local_3e8 + fVar220 * local_378 + fVar166 * local_388) &
                 0x7fffffff7fffffff;
            auVar97._8_4_ =
                 ABS(fVar215 * fVar216 +
                     fVar207 * fStack_3e0 + fVar240 * fStack_370 + fVar171 * fStack_380);
            auVar97._12_4_ =
                 ABS(fVar219 * fVar216 +
                     fVar233 * fStack_3dc + fVar153 * fStack_36c + fVar199 * fStack_37c);
            auVar74 = maxps(auVar74,auVar97);
            uVar67 = -(uint)(local_2c8 <= auVar74._0_4_);
            uVar68 = -(uint)(fStack_2c4 <= auVar74._4_4_);
            uVar69 = -(uint)(fStack_2c0 <= auVar74._8_4_);
            uVar70 = -(uint)(fStack_2bc <= auVar74._12_4_);
            fVar166 = (float)((uint)fVar299 & uVar67 | ~uVar67 & (uint)fVar103);
            fVar169 = (float)((uint)fVar303 & uVar68 | ~uVar68 & (uint)fVar197);
            fVar171 = (float)((uint)fVar290 & uVar69 | ~uVar69 & (uint)fVar198);
            fVar199 = (float)((uint)fVar292 & uVar70 | ~uVar70 & (uint)fVar218);
            fVar197 = (float)(~uVar67 & (uint)fVar244 | (uint)fVar104 & uVar67);
            fVar198 = (float)(~uVar68 & (uint)fVar257 | (uint)fVar122 & uVar68);
            fVar205 = (float)(~uVar69 & (uint)fVar258 | (uint)fVar124 & uVar69);
            fVar220 = (float)(~uVar70 & (uint)fVar272 | (uint)fVar125 & uVar70);
            fVar133 = auVar256._0_4_;
            fVar72 = auVar256._4_4_;
            fVar101 = auVar256._8_4_;
            fVar102 = auVar256._12_4_;
            auVar161._0_4_ = fVar149 * fVar149 + fVar133 * fVar133;
            auVar161._4_4_ = fVar152 * fVar152 + fVar72 * fVar72;
            auVar161._8_4_ = fVar203 * fVar203 + fVar101 * fVar101;
            auVar161._12_4_ = fVar243 * fVar243 + fVar102 * fVar102;
            auVar74 = rsqrtps(auVar194,auVar161);
            fVar103 = auVar74._0_4_;
            fVar121 = auVar74._4_4_;
            fVar123 = auVar74._8_4_;
            fVar126 = auVar74._12_4_;
            auVar195._0_4_ = fVar103 * fVar103 * auVar161._0_4_ * 0.5 * fVar103;
            auVar195._4_4_ = fVar121 * fVar121 * auVar161._4_4_ * 0.5 * fVar121;
            auVar195._8_4_ = fVar123 * fVar123 * auVar161._8_4_ * 0.5 * fVar123;
            auVar195._12_4_ = fVar126 * fVar126 * auVar161._12_4_ * 0.5 * fVar126;
            fVar165 = fVar103 * 1.5 - auVar195._0_4_;
            fVar168 = fVar121 * 1.5 - auVar195._4_4_;
            fVar173 = fVar123 * 1.5 - auVar195._8_4_;
            fVar196 = fVar126 * 1.5 - auVar195._12_4_;
            auVar162._0_4_ = fVar197 * fVar197 + fVar166 * fVar166;
            auVar162._4_4_ = fVar198 * fVar198 + fVar169 * fVar169;
            auVar162._8_4_ = fVar205 * fVar205 + fVar171 * fVar171;
            auVar162._12_4_ = fVar220 * fVar220 + fVar199 * fVar199;
            auVar74 = rsqrtps(auVar195,auVar162);
            fVar103 = auVar74._0_4_;
            fVar121 = auVar74._4_4_;
            fVar123 = auVar74._8_4_;
            fVar126 = auVar74._12_4_;
            fVar138 = fVar103 * 1.5 - fVar103 * fVar103 * auVar162._0_4_ * 0.5 * fVar103;
            fVar121 = fVar121 * 1.5 - fVar121 * fVar121 * auVar162._4_4_ * 0.5 * fVar121;
            fVar150 = fVar123 * 1.5 - fVar123 * fVar123 * auVar162._8_4_ * 0.5 * fVar123;
            fVar126 = fVar126 * 1.5 - fVar126 * fVar126 * auVar162._12_4_ * 0.5 * fVar126;
            fVar204 = fVar149 * fVar165 * (float)local_418._0_4_;
            fVar207 = fVar152 * fVar168 * (float)local_418._4_4_;
            fVar235 = fVar203 * fVar173 * (float)uStack_410;
            fVar247 = fVar243 * fVar196 * register0x0000158c;
            fVar123 = -fVar133 * fVar165 * (float)local_418._0_4_;
            fVar133 = -fVar72 * fVar168 * (float)local_418._4_4_;
            fVar149 = -fVar101 * fVar173 * (float)uStack_410;
            fVar152 = -fVar102 * fVar196 * register0x0000158c;
            fVar208 = fVar165 * 0.0 * (float)local_418._0_4_;
            fVar215 = fVar168 * 0.0 * (float)local_418._4_4_;
            fVar218 = fVar173 * 0.0 * (float)uStack_410;
            fVar219 = fVar196 * 0.0 * register0x0000158c;
            local_398._0_4_ = fVar273 + fVar208;
            local_398._4_4_ = fVar280 + fVar215;
            fStack_390 = fVar282 + fVar218;
            fStack_38c = fVar284 + fVar219;
            fVar294 = fVar197 * fVar138 * auVar192._0_4_;
            fVar296 = fVar198 * fVar121 * auVar192._4_4_;
            fVar298 = fVar205 * fVar150 * auVar192._8_4_;
            fVar302 = fVar220 * fVar126 * auVar192._12_4_;
            fVar220 = fVar279 + fVar294;
            fVar232 = fVar281 + fVar296;
            fVar240 = fVar283 + fVar298;
            fVar153 = fVar151 + fVar302;
            fVar72 = -fVar166 * fVar138 * auVar192._0_4_;
            fVar101 = -fVar169 * fVar121 * auVar192._4_4_;
            fVar102 = -fVar171 * fVar150 * auVar192._8_4_;
            fVar103 = -fVar199 * fVar126 * auVar192._12_4_;
            fVar166 = fVar270 + fVar72;
            fVar169 = fVar250 + fVar101;
            fVar171 = fStack_3b0 + fVar102;
            fVar199 = fStack_3ac + fVar103;
            fVar168 = fVar138 * 0.0 * auVar192._0_4_;
            fVar196 = fVar121 * 0.0 * auVar192._4_4_;
            fVar198 = fVar150 * 0.0 * auVar192._8_4_;
            fVar205 = fVar126 * 0.0 * auVar192._12_4_;
            fVar121 = fVar221 - fVar204;
            fVar126 = fVar230 - fVar207;
            fVar138 = fVar231 - fVar235;
            fVar150 = fVar271 - fVar247;
            fVar206 = fVar241 + fVar168;
            fVar233 = fVar245 + fVar196;
            fVar243 = fVar248 + fVar198;
            fVar301 = fVar217 + fVar205;
            fVar165 = fVar259 - fVar123;
            fVar173 = fVar260 - fVar133;
            fVar197 = fVar268 - fVar149;
            fVar203 = fVar269 - fVar152;
            fVar273 = fVar273 - fVar208;
            fVar280 = fVar280 - fVar215;
            fVar282 = fVar282 - fVar218;
            fVar284 = fVar284 - fVar219;
            uVar67 = -(uint)(0.0 < (fVar165 * (fVar206 - fVar273) - fVar273 * (fVar166 - fVar165)) *
                                   0.0 + (fVar273 * (fVar220 - fVar121) -
                                         (fVar206 - fVar273) * fVar121) * 0.0 +
                                         ((fVar166 - fVar165) * fVar121 -
                                         (fVar220 - fVar121) * fVar165));
            uVar68 = -(uint)(0.0 < (fVar173 * (fVar233 - fVar280) - fVar280 * (fVar169 - fVar173)) *
                                   0.0 + (fVar280 * (fVar232 - fVar126) -
                                         (fVar233 - fVar280) * fVar126) * 0.0 +
                                         ((fVar169 - fVar173) * fVar126 -
                                         (fVar232 - fVar126) * fVar173));
            uVar69 = -(uint)(0.0 < (fVar197 * (fVar243 - fVar282) - fVar282 * (fVar171 - fVar197)) *
                                   0.0 + (fVar282 * (fVar240 - fVar138) -
                                         (fVar243 - fVar282) * fVar138) * 0.0 +
                                         ((fVar171 - fVar197) * fVar138 -
                                         (fVar240 - fVar138) * fVar197));
            uVar70 = -(uint)(0.0 < (fVar203 * (fVar301 - fVar284) - fVar284 * (fVar199 - fVar203)) *
                                   0.0 + (fVar284 * (fVar153 - fVar150) -
                                         (fVar301 - fVar284) * fVar150) * 0.0 +
                                         ((fVar199 - fVar203) * fVar150 -
                                         (fVar153 - fVar150) * fVar203));
            local_3c8 = (float)((uint)(fVar279 - fVar294) & uVar67 |
                               ~uVar67 & (uint)(fVar221 + fVar204));
            fStack_3c4 = (float)((uint)(fVar281 - fVar296) & uVar68 |
                                ~uVar68 & (uint)(fVar230 + fVar207));
            fStack_3c0 = (float)((uint)(fVar283 - fVar298) & uVar69 |
                                ~uVar69 & (uint)(fVar231 + fVar235));
            fStack_3bc = (float)((uint)(fVar151 - fVar302) & uVar70 |
                                ~uVar70 & (uint)(fVar271 + fVar247));
            fVar208 = (float)((uint)(fVar270 - fVar72) & uVar67 |
                             ~uVar67 & (uint)(fVar259 + fVar123));
            fVar215 = (float)((uint)(fVar250 - fVar101) & uVar68 |
                             ~uVar68 & (uint)(fVar260 + fVar133));
            fStack_3b0 = (float)((uint)(fStack_3b0 - fVar102) & uVar69 |
                                ~uVar69 & (uint)(fVar268 + fVar149));
            fStack_3ac = (float)((uint)(fStack_3ac - fVar103) & uVar70 |
                                ~uVar70 & (uint)(fVar269 + fVar152));
            fVar281 = (float)((uint)(fVar241 - fVar168) & uVar67 | ~uVar67 & local_398._0_4_);
            fVar283 = (float)((uint)(fVar245 - fVar196) & uVar68 | ~uVar68 & local_398._4_4_);
            fVar151 = (float)((uint)(fVar248 - fVar198) & uVar69 | ~uVar69 & (uint)fStack_390);
            fVar204 = (float)((uint)(fVar217 - fVar205) & uVar70 | ~uVar70 & (uint)fStack_38c);
            fVar123 = (float)((uint)fVar121 & uVar67 | ~uVar67 & (uint)fVar220);
            fVar133 = (float)((uint)fVar126 & uVar68 | ~uVar68 & (uint)fVar232);
            fVar149 = (float)((uint)fVar138 & uVar69 | ~uVar69 & (uint)fVar240);
            fVar152 = (float)((uint)fVar150 & uVar70 | ~uVar70 & (uint)fVar153);
            fVar168 = (float)((uint)fVar165 & uVar67 | ~uVar67 & (uint)fVar166);
            fVar196 = (float)((uint)fVar173 & uVar68 | ~uVar68 & (uint)fVar169);
            fVar198 = (float)((uint)fVar197 & uVar69 | ~uVar69 & (uint)fVar171);
            fVar205 = (float)((uint)fVar203 & uVar70 | ~uVar70 & (uint)fVar199);
            fVar221 = (float)((uint)fVar273 & uVar67 | ~uVar67 & (uint)fVar206);
            fVar230 = (float)((uint)fVar280 & uVar68 | ~uVar68 & (uint)fVar233);
            fVar231 = (float)((uint)fVar282 & uVar69 | ~uVar69 & (uint)fVar243);
            fVar271 = (float)((uint)fVar284 & uVar70 | ~uVar70 & (uint)fVar301);
            fVar218 = (float)((uint)fVar220 & uVar67 | ~uVar67 & (uint)fVar121) - local_3c8;
            fVar219 = (float)((uint)fVar232 & uVar68 | ~uVar68 & (uint)fVar126) - fStack_3c4;
            fVar220 = (float)((uint)fVar240 & uVar69 | ~uVar69 & (uint)fVar138) - fStack_3c0;
            fVar232 = (float)((uint)fVar153 & uVar70 | ~uVar70 & (uint)fVar150) - fStack_3bc;
            fVar165 = (float)((uint)fVar166 & uVar67 | ~uVar67 & (uint)fVar165) - fVar208;
            fVar173 = (float)((uint)fVar169 & uVar68 | ~uVar68 & (uint)fVar173) - fVar215;
            fVar197 = (float)((uint)fVar171 & uVar69 | ~uVar69 & (uint)fVar197) - fStack_3b0;
            fVar203 = (float)((uint)fVar199 & uVar70 | ~uVar70 & (uint)fVar203) - fStack_3ac;
            fVar240 = (float)((uint)fVar206 & uVar67 | ~uVar67 & (uint)fVar273) - fVar281;
            fVar250 = (float)((uint)fVar233 & uVar68 | ~uVar68 & (uint)fVar280) - fVar283;
            fVar259 = (float)((uint)fVar243 & uVar69 | ~uVar69 & (uint)fVar282) - fVar151;
            fVar260 = (float)((uint)fVar301 & uVar70 | ~uVar70 & (uint)fVar284) - fVar204;
            fVar153 = local_3c8 - fVar123;
            fVar166 = fStack_3c4 - fVar133;
            fVar169 = fStack_3c0 - fVar149;
            fVar171 = fStack_3bc - fVar152;
            fVar72 = fVar208 - fVar168;
            fVar101 = fVar215 - fVar196;
            fVar102 = fStack_3b0 - fVar198;
            fVar103 = fStack_3ac - fVar205;
            local_3b8 = (RTCIntersectArguments *)CONCAT44(fVar215,fVar208);
            fVar121 = fVar281 - fVar221;
            fVar126 = fVar283 - fVar230;
            fVar138 = fVar151 - fVar231;
            fVar150 = fVar204 - fVar271;
            fVar268 = (fVar208 * fVar240 - fVar281 * fVar165) * 0.0 +
                      (fVar281 * fVar218 - local_3c8 * fVar240) * 0.0 +
                      (local_3c8 * fVar165 - fVar208 * fVar218);
            fVar269 = (fVar215 * fVar250 - fVar283 * fVar173) * 0.0 +
                      (fVar283 * fVar219 - fStack_3c4 * fVar250) * 0.0 +
                      (fStack_3c4 * fVar173 - fVar215 * fVar219);
            auVar147._4_4_ = fVar269;
            auVar147._0_4_ = fVar268;
            fVar270 = (fStack_3b0 * fVar259 - fVar151 * fVar197) * 0.0 +
                      (fVar151 * fVar220 - fStack_3c0 * fVar259) * 0.0 +
                      (fStack_3c0 * fVar197 - fStack_3b0 * fVar220);
            fVar279 = (fStack_3ac * fVar260 - fVar204 * fVar203) * 0.0 +
                      (fVar204 * fVar232 - fStack_3bc * fVar260) * 0.0 +
                      (fStack_3bc * fVar203 - fStack_3ac * fVar232);
            auVar287._0_4_ =
                 (fVar168 * fVar121 - fVar221 * fVar72) * 0.0 +
                 (fVar221 * fVar153 - fVar123 * fVar121) * 0.0 +
                 (fVar123 * fVar72 - fVar168 * fVar153);
            auVar287._4_4_ =
                 (fVar196 * fVar126 - fVar230 * fVar101) * 0.0 +
                 (fVar230 * fVar166 - fVar133 * fVar126) * 0.0 +
                 (fVar133 * fVar101 - fVar196 * fVar166);
            auVar287._8_4_ =
                 (fVar198 * fVar138 - fVar231 * fVar102) * 0.0 +
                 (fVar231 * fVar169 - fVar149 * fVar138) * 0.0 +
                 (fVar149 * fVar102 - fVar198 * fVar169);
            auVar287._12_4_ =
                 (fVar205 * fVar150 - fVar271 * fVar103) * 0.0 +
                 (fVar271 * fVar171 - fVar152 * fVar150) * 0.0 +
                 (fVar152 * fVar103 - fVar205 * fVar171);
            auVar147._8_4_ = fVar270;
            auVar147._12_4_ = fVar279;
            auVar74 = maxps(auVar147,auVar287);
            bVar52 = auVar74._0_4_ <= 0.0 && bVar52;
            auVar148._0_4_ = -(uint)bVar52;
            bVar25 = auVar74._4_4_ <= 0.0 && bVar25;
            auVar148._4_4_ = -(uint)bVar25;
            bVar26 = auVar74._8_4_ <= 0.0 && bVar26;
            auVar148._8_4_ = -(uint)bVar26;
            bVar27 = auVar74._12_4_ <= 0.0 && bVar27;
            auVar148._12_4_ = -(uint)bVar27;
            iVar53 = movmskps((int)(bezier_basis1 + lVar24),auVar148);
            if (iVar53 == 0) {
LAB_00c0a4ed:
              iVar53 = 0;
              auVar132._8_8_ = uStack_2f0;
              auVar132._0_8_ = local_2f8;
            }
            else {
              fVar123 = ray->tfar;
              fVar149 = fVar72 * fVar240 - fVar121 * fVar165;
              fVar152 = fVar101 * fVar250 - fVar126 * fVar173;
              fVar168 = fVar102 * fVar259 - fVar138 * fVar197;
              fVar196 = fVar103 * fVar260 - fVar150 * fVar203;
              fVar121 = fVar121 * fVar218 - fVar240 * fVar153;
              fVar126 = fVar126 * fVar219 - fVar250 * fVar166;
              fVar133 = fVar138 * fVar220 - fVar259 * fVar169;
              fVar138 = fVar150 * fVar232 - fVar260 * fVar171;
              fVar150 = fVar153 * fVar165 - fVar72 * fVar218;
              fVar165 = fVar166 * fVar173 - fVar101 * fVar219;
              fVar173 = fVar169 * fVar197 - fVar102 * fVar220;
              fVar197 = fVar171 * fVar203 - fVar103 * fVar232;
              auVar131._0_4_ = fVar121 * 0.0 + fVar150;
              auVar131._4_4_ = fVar126 * 0.0 + fVar165;
              auVar131._8_4_ = fVar133 * 0.0 + fVar173;
              auVar131._12_4_ = fVar138 * 0.0 + fVar197;
              auVar202._0_4_ = fVar149 * 0.0 + auVar131._0_4_;
              auVar202._4_4_ = fVar152 * 0.0 + auVar131._4_4_;
              auVar202._8_4_ = fVar168 * 0.0 + auVar131._8_4_;
              auVar202._12_4_ = fVar196 * 0.0 + auVar131._12_4_;
              auVar74 = rcpps(auVar131,auVar202);
              fVar72 = auVar74._0_4_;
              fVar101 = auVar74._4_4_;
              fVar102 = auVar74._8_4_;
              fVar103 = auVar74._12_4_;
              fVar72 = (1.0 - auVar202._0_4_ * fVar72) * fVar72 + fVar72;
              fVar101 = (1.0 - auVar202._4_4_ * fVar101) * fVar101 + fVar101;
              fVar102 = (1.0 - auVar202._8_4_ * fVar102) * fVar102 + fVar102;
              fVar103 = (1.0 - auVar202._12_4_ * fVar103) * fVar103 + fVar103;
              fVar121 = (fVar281 * fVar150 + fVar208 * fVar121 + local_3c8 * fVar149) * fVar72;
              fVar126 = (fVar283 * fVar165 + fVar215 * fVar126 + fStack_3c4 * fVar152) * fVar101;
              fVar133 = (fVar151 * fVar173 + fStack_3b0 * fVar133 + fStack_3c0 * fVar168) * fVar102;
              fVar138 = (fVar204 * fVar197 + fStack_3ac * fVar138 + fStack_3bc * fVar196) * fVar103;
              bVar52 = (fVar121 <= fVar123 && (float)local_1e8._0_4_ <= fVar121) && bVar52;
              auVar163._0_4_ = -(uint)bVar52;
              bVar25 = (fVar126 <= fVar123 && (float)local_1e8._4_4_ <= fVar126) && bVar25;
              auVar163._4_4_ = -(uint)bVar25;
              bVar26 = (fVar133 <= fVar123 && fStack_1e0 <= fVar133) && bVar26;
              auVar163._8_4_ = -(uint)bVar26;
              bVar27 = (fVar138 <= fVar123 && fStack_1dc <= fVar138) && bVar27;
              auVar163._12_4_ = -(uint)bVar27;
              iVar53 = movmskps(iVar53,auVar163);
              if (iVar53 == 0) goto LAB_00c0a4ed;
              auVar164._0_8_ =
                   CONCAT44(-(uint)(auVar202._4_4_ != 0.0 && bVar25),
                            -(uint)(auVar202._0_4_ != 0.0 && bVar52));
              auVar164._8_4_ = -(uint)(auVar202._8_4_ != 0.0 && bVar26);
              auVar164._12_4_ = -(uint)(auVar202._12_4_ != 0.0 && bVar27);
              iVar53 = movmskps(iVar53,auVar164);
              auVar132._8_8_ = uStack_2f0;
              auVar132._0_8_ = local_2f8;
              if (iVar53 != 0) {
                fVar268 = fVar268 * fVar72;
                fVar269 = fVar269 * fVar101;
                fVar270 = fVar270 * fVar102;
                fVar279 = fVar279 * fVar103;
                local_308 = (float)((uint)(1.0 - fVar268) & uVar67 | ~uVar67 & (uint)fVar268);
                fStack_304 = (float)((uint)(1.0 - fVar269) & uVar68 | ~uVar68 & (uint)fVar269);
                fStack_300 = (float)((uint)(1.0 - fVar270) & uVar69 | ~uVar69 & (uint)fVar270);
                fStack_2fc = (float)((uint)(1.0 - fVar279) & uVar70 | ~uVar70 & (uint)fVar279);
                local_1b8 = (float)(~uVar67 & (uint)(auVar287._0_4_ * fVar72) |
                                   (uint)(1.0 - auVar287._0_4_ * fVar72) & uVar67);
                fStack_1b4 = (float)(~uVar68 & (uint)(auVar287._4_4_ * fVar101) |
                                    (uint)(1.0 - auVar287._4_4_ * fVar101) & uVar68);
                fStack_1b0 = (float)(~uVar69 & (uint)(auVar287._8_4_ * fVar102) |
                                    (uint)(1.0 - auVar287._8_4_ * fVar102) & uVar69);
                fStack_1ac = (float)(~uVar70 & (uint)(auVar287._12_4_ * fVar103) |
                                    (uint)(1.0 - auVar287._12_4_ * fVar103) & uVar70);
                auVar132._8_4_ = auVar164._8_4_;
                auVar132._0_8_ = auVar164._0_8_;
                auVar132._12_4_ = auVar164._12_4_;
                local_288 = fVar121;
                fStack_284 = fVar126;
                fStack_280 = fVar133;
                fStack_27c = fVar138;
              }
            }
            iVar53 = movmskps(iVar53,auVar132);
            _local_3d8 = auVar192;
            _local_348 = auVar214;
            local_268 = fVar244;
            fStack_264 = fVar257;
            fStack_260 = fVar258;
            fStack_25c = fVar272;
            if (iVar53 != 0) {
              fVar101 = (auVar192._0_4_ - (float)local_418._0_4_) * local_308 +
                        (float)local_418._0_4_;
              fVar102 = (auVar192._4_4_ - (float)local_418._4_4_) * fStack_304 +
                        (float)local_418._4_4_;
              fVar103 = (auVar192._8_4_ - (float)uStack_410) * fStack_300 + (float)uStack_410;
              fVar121 = (auVar192._12_4_ - register0x0000158c) * fStack_2fc + register0x0000158c;
              fVar72 = local_310->depth_scale;
              auVar98._0_4_ = -(uint)(fVar72 * (fVar101 + fVar101) < local_288) & auVar132._0_4_;
              auVar98._4_4_ = -(uint)(fVar72 * (fVar102 + fVar102) < fStack_284) & auVar132._4_4_;
              auVar98._8_4_ = -(uint)(fVar72 * (fVar103 + fVar103) < fStack_280) & auVar132._8_4_;
              auVar98._12_4_ = -(uint)(fVar72 * (fVar121 + fVar121) < fStack_27c) & auVar132._12_4_;
              uVar67 = movmskps((int)local_310,auVar98);
              if (uVar67 != 0) {
                local_1b8 = local_1b8 + local_1b8 + -1.0;
                fStack_1b4 = fStack_1b4 + fStack_1b4 + -1.0;
                fStack_1b0 = fStack_1b0 + fStack_1b0 + -1.0;
                fStack_1ac = fStack_1ac + fStack_1ac + -1.0;
                local_148 = CONCAT44(fStack_244,local_248);
                uStack_140 = CONCAT44(fStack_23c,fStack_240);
                local_138 = CONCAT44(fStack_84,local_88);
                uStack_130 = CONCAT44(fStack_7c,fStack_80);
                local_128 = CONCAT44(fStack_94,local_98);
                uStack_120 = CONCAT44(fStack_8c,fStack_90);
                local_118 = CONCAT44(fStack_74,local_78);
                uStack_110 = CONCAT44(fStack_6c,fStack_70);
                auVar61 = (undefined1  [8])(context->scene->geometries).items[local_318].ptr;
                local_188 = local_308;
                fStack_184 = fStack_304;
                fStack_180 = fStack_300;
                fStack_17c = fStack_2fc;
                local_178 = local_1b8;
                fStack_174 = fStack_1b4;
                fStack_170 = fStack_1b0;
                fStack_16c = fStack_1ac;
                local_168 = local_288;
                fStack_164 = fStack_284;
                fStack_160 = fStack_280;
                fStack_15c = fStack_27c;
                local_158 = uVar66;
                local_108 = auVar98;
                if ((((Geometry *)auVar61)->mask & ray->mask) == 0) {
                  pRVar58 = (RTCIntersectArguments *)0x0;
                  local_154 = fVar135;
                }
                else {
                  pRVar58 = context->args;
                  if ((pRVar58->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar58 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar58 >> 8),1),
                     local_154 = fVar135,
                     ((Geometry *)auVar61)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar72 = (float)(int)uVar66;
                    local_f8[0] = (fVar72 + local_308 + 0.0) * (float)local_1f8._0_4_;
                    local_f8[1] = (fVar72 + fStack_304 + 1.0) * (float)local_1f8._4_4_;
                    local_f8[2] = (fVar72 + fStack_300 + 2.0) * fStack_1f0;
                    local_f8[3] = (fVar72 + fStack_2fc + 3.0) * fStack_1ec;
                    local_e8 = CONCAT44(fStack_1b4,local_1b8);
                    uStack_e0 = CONCAT44(fStack_1ac,fStack_1b0);
                    local_d8[0] = local_288;
                    local_d8[1] = fStack_284;
                    local_d8[2] = fStack_280;
                    local_d8[3] = fStack_27c;
                    uVar62 = (ulong)(uVar67 & 0xff);
                    pRVar56 = (RTCIntersectArguments *)0x0;
                    if (uVar62 != 0) {
                      for (; ((uVar67 & 0xff) >> (long)pRVar56 & 1) == 0;
                          pRVar56 = (RTCIntersectArguments *)((long)&pRVar56->flags + 1)) {
                      }
                    }
                    uStack_3d0 = uStack_130;
                    local_3d8 = (undefined1  [8])local_138;
                    uVar59 = CONCAT71((int7)((ulong)pRVar58 >> 8),1);
                    local_418 = auVar61;
                    local_338 = local_128;
                    uStack_330 = uStack_120;
                    local_258 = local_118;
                    uStack_250 = uStack_110;
                    local_154 = fVar135;
                    do {
                      local_348._0_4_ = (int)uVar59;
                      local_22c = local_f8[(long)pRVar56];
                      local_228 = *(undefined4 *)((long)&local_e8 + (long)pRVar56 * 4);
                      local_3c8 = ray->tfar;
                      ray->tfar = local_d8[(long)pRVar56];
                      local_2b8.context = context->user;
                      fVar72 = 1.0 - local_22c;
                      fVar102 = local_22c * fVar72 + local_22c * fVar72;
                      fVar101 = fVar72 * fVar72 * -3.0;
                      fVar103 = (fVar72 * fVar72 - fVar102) * 3.0;
                      fVar72 = (fVar102 - local_22c * local_22c) * 3.0;
                      fVar102 = local_22c * local_22c * 3.0;
                      local_238 = CONCAT44(fVar101 * fStack_244 +
                                           fVar103 * (float)local_3d8._4_4_ +
                                           fVar72 * local_338._4_4_ + fVar102 * local_258._4_4_,
                                           fVar101 * local_248 +
                                           fVar103 * (float)local_3d8._0_4_ +
                                           fVar72 * (float)local_338 + fVar102 * (float)local_258);
                      local_230 = fVar101 * fStack_240 +
                                  fVar103 * (float)uStack_3d0 +
                                  fVar72 * (float)uStack_330 + fVar102 * (float)uStack_250;
                      local_224 = (undefined4)local_200;
                      local_220 = (undefined4)local_318;
                      local_21c = (local_2b8.context)->instID[0];
                      local_218 = (local_2b8.context)->instPrimID[0];
                      local_41c = -1;
                      local_2b8.valid = &local_41c;
                      pRVar58 = (RTCIntersectArguments *)((Geometry *)auVar61)->userPtr;
                      local_2b8.hit = (RTCHitN *)&local_238;
                      local_2b8.N = 1;
                      local_3b8 = pRVar56;
                      local_2b8.geometryUserPtr = pRVar58;
                      local_2b8.ray = (RTCRayN *)ray;
                      if (((Geometry *)auVar61)->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00c0a3ea:
                        pRVar58 = context->args;
                        if (pRVar58->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar58->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((((Geometry *)auVar61)->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar58->filter)(&local_2b8);
                            auVar61 = local_418;
                          }
                          if (*local_2b8.valid == 0) goto LAB_00c0a430;
                        }
                        uVar59 = (ulong)(uint)local_348._0_4_;
                        break;
                      }
                      (*((Geometry *)auVar61)->occlusionFilterN)(&local_2b8);
                      auVar61 = local_418;
                      if (*local_2b8.valid != 0) goto LAB_00c0a3ea;
LAB_00c0a430:
                      ray->tfar = local_3c8;
                      uVar62 = uVar62 ^ 1L << ((ulong)local_3b8 & 0x3f);
                      pRVar56 = (RTCIntersectArguments *)0x0;
                      if (uVar62 != 0) {
                        for (; (uVar62 >> (long)pRVar56 & 1) == 0;
                            pRVar56 = (RTCIntersectArguments *)((long)&pRVar56->flags + 1)) {
                        }
                      }
                      uVar59 = CONCAT71((int7)((ulong)pRVar58 >> 8),uVar62 != 0);
                    } while (uVar62 != 0);
                    pRVar58 = (RTCIntersectArguments *)(uVar59 & 0xffffffffffffff01);
                  }
                }
                bVar64 = (bool)(bVar64 | (byte)pRVar58);
              }
            }
          }
          uVar57 = SUB84(pRVar58,0);
          lVar60 = lVar60 + 4;
          fVar197 = local_408;
          fVar218 = fStack_404;
          fVar219 = fStack_400;
          fVar220 = fStack_3fc;
          fVar198 = local_3f8;
          fVar232 = fStack_3f4;
          fVar240 = fStack_3f0;
          fVar244 = fStack_3ec;
          fVar103 = local_3a8;
          fVar250 = fStack_3a4;
          fVar257 = fStack_3a0;
          fVar258 = fStack_39c;
        } while ((int)lVar60 < (int)fVar135);
      }
      if (bVar64 != false) {
        return local_449;
      }
      fVar135 = ray->tfar;
      auVar120._4_4_ = -(uint)(fStack_44 <= fVar135);
      auVar120._0_4_ = -(uint)(local_48 <= fVar135);
      auVar120._8_4_ = -(uint)(fStack_40 <= fVar135);
      auVar120._12_4_ = -(uint)(fStack_3c <= fVar135);
      uVar66 = movmskps(uVar57,auVar120);
      uVar65 = uVar65 & uVar65 + 0xf & uVar66;
      local_449 = uVar65 != 0;
    } while (local_449);
  }
  return local_449;
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }